

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<4,16>::
     occluded_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Primitive PVar5;
  uint uVar6;
  int iVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  long lVar51;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  byte bVar54;
  ulong uVar55;
  long lVar56;
  long lVar57;
  ulong uVar58;
  Geometry *geometry;
  long lVar59;
  uint uVar60;
  ulong uVar61;
  byte bVar62;
  float fVar63;
  float fVar109;
  float fVar111;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar69 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar64;
  undefined1 auVar70 [16];
  float fVar110;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined4 uVar115;
  float fVar123;
  float fVar124;
  vint4 bi_2;
  float fVar125;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [64];
  vint4 bi_1;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  vint4 bi;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  float fVar137;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  vint4 ai_2;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  vint4 ai;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar153;
  float fVar157;
  float fVar158;
  vint4 ai_1;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar159;
  float fVar160;
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [64];
  undefined1 auVar176 [16];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  vint<16> mask;
  float old_t_1;
  RTCFilterFunctionNArguments local_910;
  undefined1 local_8e0 [32];
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [16];
  undefined1 local_890 [16];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  LinearSpace3fa *local_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_730 [8];
  float fStack_728;
  float fStack_724;
  undefined8 local_720;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [64];
  uint local_6c0;
  uint uStack_6bc;
  uint uStack_6b8;
  uint uStack_6b4;
  uint uStack_6b0;
  uint uStack_6ac;
  uint uStack_6a8;
  uint uStack_6a4;
  undefined4 local_6a0;
  undefined4 uStack_69c;
  undefined4 uStack_698;
  undefined4 uStack_694;
  undefined4 uStack_690;
  undefined4 uStack_68c;
  undefined4 uStack_688;
  undefined4 uStack_684;
  undefined1 local_670 [16];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined4 local_600;
  int local_5fc;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  float local_5a0 [4];
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  undefined1 auVar171 [64];
  
  PVar5 = prim[1];
  uVar58 = (ulong)(byte)PVar5;
  fVar137 = *(float *)(prim + uVar58 * 0x19 + 0x12);
  auVar68 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar66 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar66 = vinsertps_avx(auVar66,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar68 = vsubps_avx(auVar68,*(undefined1 (*) [16])(prim + uVar58 * 0x19 + 6));
  auVar138._0_4_ = fVar137 * auVar68._0_4_;
  auVar138._4_4_ = fVar137 * auVar68._4_4_;
  auVar138._8_4_ = fVar137 * auVar68._8_4_;
  auVar138._12_4_ = fVar137 * auVar68._12_4_;
  auVar70._0_4_ = fVar137 * auVar66._0_4_;
  auVar70._4_4_ = fVar137 * auVar66._4_4_;
  auVar70._8_4_ = fVar137 * auVar66._8_4_;
  auVar70._12_4_ = fVar137 * auVar66._12_4_;
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 4 + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 5 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar176 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 6 + 6)));
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0xb + 6)));
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar5 * 0xc + uVar58 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  uVar61 = (ulong)(uint)((int)(uVar58 * 9) * 2);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 + uVar58 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  uVar55 = (ulong)(uint)((int)(uVar58 * 5) << 2);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar166._4_4_ = auVar70._0_4_;
  auVar166._0_4_ = auVar70._0_4_;
  auVar166._8_4_ = auVar70._0_4_;
  auVar166._12_4_ = auVar70._0_4_;
  auVar22 = vshufps_avx(auVar70,auVar70,0x55);
  auVar67 = vshufps_avx(auVar70,auVar70,0xaa);
  fVar137 = auVar67._0_4_;
  auVar130._0_4_ = fVar137 * auVar176._0_4_;
  fVar123 = auVar67._4_4_;
  auVar130._4_4_ = fVar123 * auVar176._4_4_;
  fVar124 = auVar67._8_4_;
  auVar130._8_4_ = fVar124 * auVar176._8_4_;
  fVar125 = auVar67._12_4_;
  auVar130._12_4_ = fVar125 * auVar176._12_4_;
  auVar126._0_4_ = auVar18._0_4_ * fVar137;
  auVar126._4_4_ = auVar18._4_4_ * fVar123;
  auVar126._8_4_ = auVar18._8_4_ * fVar124;
  auVar126._12_4_ = auVar18._12_4_ * fVar125;
  auVar116._0_4_ = auVar21._0_4_ * fVar137;
  auVar116._4_4_ = auVar21._4_4_ * fVar123;
  auVar116._8_4_ = auVar21._8_4_ * fVar124;
  auVar116._12_4_ = auVar21._12_4_ * fVar125;
  auVar67 = vfmadd231ps_fma(auVar130,auVar22,auVar66);
  auVar69 = vfmadd231ps_fma(auVar126,auVar22,auVar17);
  auVar22 = vfmadd231ps_fma(auVar116,auVar20,auVar22);
  auVar65 = vfmadd231ps_fma(auVar67,auVar166,auVar68);
  auVar69 = vfmadd231ps_fma(auVar69,auVar166,auVar16);
  auVar70 = vfmadd231ps_fma(auVar22,auVar19,auVar166);
  auVar167._4_4_ = auVar138._0_4_;
  auVar167._0_4_ = auVar138._0_4_;
  auVar167._8_4_ = auVar138._0_4_;
  auVar167._12_4_ = auVar138._0_4_;
  auVar22 = vshufps_avx(auVar138,auVar138,0x55);
  auVar67 = vshufps_avx(auVar138,auVar138,0xaa);
  fVar137 = auVar67._0_4_;
  auVar172._0_4_ = fVar137 * auVar176._0_4_;
  fVar123 = auVar67._4_4_;
  auVar172._4_4_ = fVar123 * auVar176._4_4_;
  fVar124 = auVar67._8_4_;
  auVar172._8_4_ = fVar124 * auVar176._8_4_;
  fVar125 = auVar67._12_4_;
  auVar172._12_4_ = fVar125 * auVar176._12_4_;
  auVar144._0_4_ = auVar18._0_4_ * fVar137;
  auVar144._4_4_ = auVar18._4_4_ * fVar123;
  auVar144._8_4_ = auVar18._8_4_ * fVar124;
  auVar144._12_4_ = auVar18._12_4_ * fVar125;
  auVar139._0_4_ = auVar21._0_4_ * fVar137;
  auVar139._4_4_ = auVar21._4_4_ * fVar123;
  auVar139._8_4_ = auVar21._8_4_ * fVar124;
  auVar139._12_4_ = auVar21._12_4_ * fVar125;
  auVar66 = vfmadd231ps_fma(auVar172,auVar22,auVar66);
  auVar176 = vfmadd231ps_fma(auVar144,auVar22,auVar17);
  auVar17 = vfmadd231ps_fma(auVar139,auVar22,auVar20);
  auVar18 = vfmadd231ps_fma(auVar66,auVar167,auVar68);
  auVar20 = vfmadd231ps_fma(auVar176,auVar167,auVar16);
  auVar161._8_4_ = 0x7fffffff;
  auVar161._0_8_ = 0x7fffffff7fffffff;
  auVar161._12_4_ = 0x7fffffff;
  auVar21 = vfmadd231ps_fma(auVar17,auVar167,auVar19);
  auVar68 = vandps_avx(auVar65,auVar161);
  auVar154._8_4_ = 0x219392ef;
  auVar154._0_8_ = 0x219392ef219392ef;
  auVar154._12_4_ = 0x219392ef;
  uVar61 = vcmpps_avx512vl(auVar68,auVar154,1);
  bVar10 = (bool)((byte)uVar61 & 1);
  auVar67._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar65._0_4_;
  bVar10 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar67._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar65._4_4_;
  bVar10 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar67._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar65._8_4_;
  bVar10 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar67._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar65._12_4_;
  auVar68 = vandps_avx(auVar69,auVar161);
  uVar61 = vcmpps_avx512vl(auVar68,auVar154,1);
  bVar10 = (bool)((byte)uVar61 & 1);
  auVar65._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar69._0_4_;
  bVar10 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar65._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar69._4_4_;
  bVar10 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar65._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar69._8_4_;
  bVar10 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar65._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar69._12_4_;
  auVar68 = vandps_avx(auVar70,auVar161);
  uVar61 = vcmpps_avx512vl(auVar68,auVar154,1);
  bVar10 = (bool)((byte)uVar61 & 1);
  auVar69._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar70._0_4_;
  bVar10 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar69._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar70._4_4_;
  bVar10 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar69._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar70._8_4_;
  bVar10 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar69._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar70._12_4_;
  auVar66 = vrcp14ps_avx512vl(auVar67);
  auVar155._8_4_ = 0x3f800000;
  auVar155._0_8_ = 0x3f8000003f800000;
  auVar155._12_4_ = 0x3f800000;
  auVar68 = vfnmadd213ps_fma(auVar67,auVar66,auVar155);
  auVar16 = vfmadd132ps_fma(auVar68,auVar66,auVar66);
  auVar66 = vrcp14ps_avx512vl(auVar65);
  auVar68 = vfnmadd213ps_fma(auVar65,auVar66,auVar155);
  auVar17 = vfmadd132ps_fma(auVar68,auVar66,auVar66);
  auVar66 = vrcp14ps_avx512vl(auVar69);
  auVar68 = vfnmadd213ps_fma(auVar69,auVar66,auVar155);
  auVar19 = vfmadd132ps_fma(auVar68,auVar66,auVar66);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar58 * 7 + 6);
  auVar68 = vpmovsxwd_avx(auVar68);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,auVar18);
  auVar150._0_4_ = auVar16._0_4_ * auVar68._0_4_;
  auVar150._4_4_ = auVar16._4_4_ * auVar68._4_4_;
  auVar150._8_4_ = auVar16._8_4_ * auVar68._8_4_;
  auVar150._12_4_ = auVar16._12_4_ * auVar68._12_4_;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar58 * 9 + 6);
  auVar68 = vpmovsxwd_avx(auVar66);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,auVar18);
  auVar67 = vpbroadcastd_avx512vl();
  auVar176._8_8_ = 0;
  auVar176._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  auVar66 = vpmovsxwd_avx(auVar176);
  auVar131._0_4_ = auVar16._0_4_ * auVar68._0_4_;
  auVar131._4_4_ = auVar16._4_4_ * auVar68._4_4_;
  auVar131._8_4_ = auVar16._8_4_ * auVar68._8_4_;
  auVar131._12_4_ = auVar16._12_4_ * auVar68._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar58 * -2 + 6);
  auVar68 = vpmovsxwd_avx(auVar16);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,auVar20);
  auVar156._0_4_ = auVar17._0_4_ * auVar68._0_4_;
  auVar156._4_4_ = auVar17._4_4_ * auVar68._4_4_;
  auVar156._8_4_ = auVar17._8_4_ * auVar68._8_4_;
  auVar156._12_4_ = auVar17._12_4_ * auVar68._12_4_;
  auVar68 = vcvtdq2ps_avx(auVar66);
  auVar68 = vsubps_avx(auVar68,auVar20);
  auVar127._0_4_ = auVar17._0_4_ * auVar68._0_4_;
  auVar127._4_4_ = auVar17._4_4_ * auVar68._4_4_;
  auVar127._8_4_ = auVar17._8_4_ * auVar68._8_4_;
  auVar127._12_4_ = auVar17._12_4_ * auVar68._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar55 + uVar58 + 6);
  auVar68 = vpmovsxwd_avx(auVar17);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,auVar21);
  auVar145._0_4_ = auVar19._0_4_ * auVar68._0_4_;
  auVar145._4_4_ = auVar19._4_4_ * auVar68._4_4_;
  auVar145._8_4_ = auVar19._8_4_ * auVar68._8_4_;
  auVar145._12_4_ = auVar19._12_4_ * auVar68._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar58 * 0x17 + 6);
  auVar68 = vpmovsxwd_avx(auVar18);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,auVar21);
  auVar117._0_4_ = auVar19._0_4_ * auVar68._0_4_;
  auVar117._4_4_ = auVar19._4_4_ * auVar68._4_4_;
  auVar117._8_4_ = auVar19._8_4_ * auVar68._8_4_;
  auVar117._12_4_ = auVar19._12_4_ * auVar68._12_4_;
  auVar68 = vpminsd_avx(auVar150,auVar131);
  auVar66 = vpminsd_avx(auVar156,auVar127);
  auVar68 = vmaxps_avx(auVar68,auVar66);
  auVar66 = vpminsd_avx(auVar145,auVar117);
  uVar115 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar19._4_4_ = uVar115;
  auVar19._0_4_ = uVar115;
  auVar19._8_4_ = uVar115;
  auVar19._12_4_ = uVar115;
  auVar66 = vmaxps_avx512vl(auVar66,auVar19);
  auVar68 = vmaxps_avx(auVar68,auVar66);
  auVar20._8_4_ = 0x3f7ffffa;
  auVar20._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar20._12_4_ = 0x3f7ffffa;
  local_670 = vmulps_avx512vl(auVar68,auVar20);
  auVar68 = vpmaxsd_avx(auVar150,auVar131);
  auVar66 = vpmaxsd_avx(auVar156,auVar127);
  auVar68 = vminps_avx(auVar68,auVar66);
  auVar66 = vpmaxsd_avx(auVar145,auVar117);
  uVar115 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar21._4_4_ = uVar115;
  auVar21._0_4_ = uVar115;
  auVar21._8_4_ = uVar115;
  auVar21._12_4_ = uVar115;
  auVar66 = vminps_avx512vl(auVar66,auVar21);
  auVar68 = vminps_avx(auVar68,auVar66);
  auVar22._8_4_ = 0x3f800003;
  auVar22._0_8_ = 0x3f8000033f800003;
  auVar22._12_4_ = 0x3f800003;
  auVar68 = vmulps_avx512vl(auVar68,auVar22);
  uVar23 = vcmpps_avx512vl(local_670,auVar68,2);
  uVar61 = vpcmpgtd_avx512vl(auVar67,_DAT_01f7fcf0);
  uVar61 = ((byte)uVar23 & 0xf) & uVar61;
  if ((char)uVar61 == '\0') {
    bVar62 = 0;
  }
  else {
    local_7c8 = pre->ray_space + k;
    auVar122 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar122);
    do {
      auVar122 = local_440;
      lVar59 = 0;
      for (uVar55 = uVar61; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
        lVar59 = lVar59 + 1;
      }
      uVar6 = *(uint *)(prim + 2);
      pGVar8 = (context->scene->geometries).items[uVar6].ptr;
      local_400._0_8_ = CONCAT44(0,*(uint *)(prim + lVar59 * 4 + 6));
      uVar55 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                               CONCAT44(0,*(uint *)(prim + lVar59 * 4 + 6)) *
                               pGVar8[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      lVar56 = (long)pGVar8[1].intersectionFilterN * uVar55;
      lVar59 = *(long *)&pGVar8[1].time_range.upper;
      local_8a0 = *(undefined1 (*) [16])(lVar59 + lVar56);
      lVar57 = (long)pGVar8[1].intersectionFilterN * (uVar55 + 1);
      _local_730 = *(undefined1 (*) [16])(lVar59 + lVar57);
      uVar58 = (long)pGVar8[2].pointQueryFunc * (uVar55 + 1);
      iVar7 = (int)pGVar8[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar68 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40))
                              ,0x1c);
      auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      lVar51 = (long)iVar7 * 0x44;
      auVar132._8_4_ = 0xbeaaaaab;
      auVar132._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar132._12_4_ = 0xbeaaaaab;
      local_890 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                    (pGVar8[2].intersectionFilterN +
                                    uVar55 * (long)pGVar8[2].pointQueryFunc),local_8a0,auVar132);
      local_8b0 = vfmadd132ps_fma(*(undefined1 (*) [16])(pGVar8[2].intersectionFilterN + uVar58),
                                  _local_730,auVar132);
      auVar176 = vsubps_avx(local_8a0,auVar68);
      uVar115 = auVar176._0_4_;
      auVar133._4_4_ = uVar115;
      auVar133._0_4_ = uVar115;
      auVar133._8_4_ = uVar115;
      auVar133._12_4_ = uVar115;
      auVar66 = vshufps_avx(auVar176,auVar176,0x55);
      aVar3 = (local_7c8->vx).field_0;
      aVar4 = (local_7c8->vy).field_0;
      fVar137 = (local_7c8->vz).field_0.m128[0];
      fVar123 = *(float *)((long)&(local_7c8->vz).field_0 + 4);
      fVar124 = *(float *)((long)&(local_7c8->vz).field_0 + 8);
      fVar125 = *(float *)((long)&(local_7c8->vz).field_0 + 0xc);
      auVar176 = vshufps_avx(auVar176,auVar176,0xaa);
      auVar164._0_4_ = fVar137 * auVar176._0_4_;
      auVar164._4_4_ = fVar123 * auVar176._4_4_;
      auVar164._8_4_ = fVar124 * auVar176._8_4_;
      auVar164._12_4_ = fVar125 * auVar176._12_4_;
      auVar66 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar4,auVar66);
      auVar16 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar3,auVar133);
      auVar176 = vsubps_avx(local_890,auVar68);
      uVar115 = auVar176._0_4_;
      auVar134._4_4_ = uVar115;
      auVar134._0_4_ = uVar115;
      auVar134._8_4_ = uVar115;
      auVar134._12_4_ = uVar115;
      auVar66 = vshufps_avx(auVar176,auVar176,0x55);
      auVar176 = vshufps_avx(auVar176,auVar176,0xaa);
      auVar165._0_4_ = fVar137 * auVar176._0_4_;
      auVar165._4_4_ = fVar123 * auVar176._4_4_;
      auVar165._8_4_ = fVar124 * auVar176._8_4_;
      auVar165._12_4_ = fVar125 * auVar176._12_4_;
      auVar66 = vfmadd231ps_fma(auVar165,(undefined1  [16])aVar4,auVar66);
      auVar17 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar3,auVar134);
      auVar176 = vsubps_avx(local_8b0,auVar68);
      uVar115 = auVar176._0_4_;
      auVar135._4_4_ = uVar115;
      auVar135._0_4_ = uVar115;
      auVar135._8_4_ = uVar115;
      auVar135._12_4_ = uVar115;
      auVar66 = vshufps_avx(auVar176,auVar176,0x55);
      auVar176 = vshufps_avx(auVar176,auVar176,0xaa);
      auVar168._0_4_ = fVar137 * auVar176._0_4_;
      auVar168._4_4_ = fVar123 * auVar176._4_4_;
      auVar168._8_4_ = fVar124 * auVar176._8_4_;
      auVar168._12_4_ = fVar125 * auVar176._12_4_;
      auVar66 = vfmadd231ps_fma(auVar168,(undefined1  [16])aVar4,auVar66);
      auVar176 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar3,auVar135);
      auVar66 = vsubps_avx(_local_730,auVar68);
      uVar115 = auVar66._0_4_;
      auVar128._4_4_ = uVar115;
      auVar128._0_4_ = uVar115;
      auVar128._8_4_ = uVar115;
      auVar128._12_4_ = uVar115;
      auVar68 = vshufps_avx(auVar66,auVar66,0x55);
      auVar66 = vshufps_avx(auVar66,auVar66,0xaa);
      auVar173._0_4_ = fVar137 * auVar66._0_4_;
      auVar173._4_4_ = fVar123 * auVar66._4_4_;
      auVar173._8_4_ = fVar124 * auVar66._8_4_;
      auVar173._12_4_ = fVar125 * auVar66._12_4_;
      auVar68 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar4,auVar68);
      auVar18 = vfmadd231ps_fma(auVar68,(undefined1  [16])aVar3,auVar128);
      auVar84 = *(undefined1 (*) [32])(bezier_basis0 + lVar51);
      uVar115 = auVar16._0_4_;
      local_780._4_4_ = uVar115;
      local_780._0_4_ = uVar115;
      local_780._8_4_ = uVar115;
      local_780._12_4_ = uVar115;
      local_780._16_4_ = uVar115;
      local_780._20_4_ = uVar115;
      local_780._24_4_ = uVar115;
      local_780._28_4_ = uVar115;
      auVar85 = *(undefined1 (*) [32])(bezier_basis0 + lVar51 + 0x484);
      auVar71._8_4_ = 1;
      auVar71._0_8_ = 0x100000001;
      auVar71._12_4_ = 1;
      auVar71._16_4_ = 1;
      auVar71._20_4_ = 1;
      auVar71._24_4_ = 1;
      auVar71._28_4_ = 1;
      local_7a0 = vpermps_avx2(auVar71,ZEXT1632(auVar16));
      local_8e0 = vbroadcastss_avx512vl(auVar17);
      local_800 = vpermps_avx512vl(auVar71,ZEXT1632(auVar17));
      auVar180 = ZEXT3264(local_800);
      auVar83 = *(undefined1 (*) [32])(bezier_basis0 + lVar51 + 0x908);
      local_820 = vbroadcastss_avx512vl(auVar176);
      auVar182 = ZEXT3264(local_820);
      local_840 = vpermps_avx512vl(auVar71,ZEXT1632(auVar176));
      auVar181 = ZEXT3264(local_840);
      auVar82 = *(undefined1 (*) [32])(bezier_basis0 + lVar51 + 0xd8c);
      local_860 = vbroadcastss_avx512vl(auVar18);
      auVar183 = ZEXT3264(local_860);
      local_880 = vpermps_avx512vl(auVar71,ZEXT1632(auVar18));
      auVar184 = ZEXT3264(local_880);
      auVar71 = vmulps_avx512vl(local_860,auVar82);
      auVar72 = vmulps_avx512vl(local_880,auVar82);
      auVar71 = vfmadd231ps_avx512vl(auVar71,auVar83,local_820);
      auVar72 = vfmadd231ps_avx512vl(auVar72,auVar83,local_840);
      auVar71 = vfmadd231ps_avx512vl(auVar71,auVar85,local_8e0);
      auVar73 = vfmadd231ps_avx512vl(auVar72,auVar85,local_800);
      auVar19 = vfmadd231ps_fma(auVar71,auVar84,local_780);
      auVar71 = *(undefined1 (*) [32])(bezier_basis1 + lVar51);
      auVar72 = *(undefined1 (*) [32])(bezier_basis1 + lVar51 + 0x484);
      auVar81 = *(undefined1 (*) [32])(bezier_basis1 + lVar51 + 0x908);
      auVar20 = vfmadd231ps_fma(auVar73,auVar84,local_7a0);
      auVar73 = *(undefined1 (*) [32])(bezier_basis1 + lVar51 + 0xd8c);
      auVar74 = vmulps_avx512vl(local_860,auVar73);
      auVar75 = vmulps_avx512vl(local_880,auVar73);
      auVar74 = vfmadd231ps_avx512vl(auVar74,auVar81,local_820);
      auVar75 = vfmadd231ps_avx512vl(auVar75,auVar81,local_840);
      auVar74 = vfmadd231ps_avx512vl(auVar74,auVar72,local_8e0);
      auVar75 = vfmadd231ps_avx512vl(auVar75,auVar72,local_800);
      auVar21 = vfmadd231ps_fma(auVar74,auVar71,local_780);
      auVar22 = vfmadd231ps_fma(auVar75,auVar71,local_7a0);
      auVar74 = vsubps_avx512vl(ZEXT1632(auVar21),ZEXT1632(auVar19));
      auVar75 = vsubps_avx512vl(ZEXT1632(auVar22),ZEXT1632(auVar20));
      auVar76 = vmulps_avx512vl(ZEXT1632(auVar20),auVar74);
      auVar77 = vmulps_avx512vl(ZEXT1632(auVar19),auVar75);
      auVar76 = vsubps_avx512vl(auVar76,auVar77);
      auVar68 = vshufps_avx(local_890,local_890,0xff);
      local_320 = vbroadcastsd_avx512vl(auVar68);
      auVar68 = vshufps_avx(local_8b0,local_8b0,0xff);
      local_340 = vbroadcastsd_avx512vl(auVar68);
      _local_360 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar59 + 0xc + lVar57)));
      auVar77 = vmulps_avx512vl(_local_360,auVar82);
      auVar77 = vfmadd231ps_avx512vl(auVar77,auVar83,local_340);
      auVar77 = vfmadd231ps_avx512vl(auVar77,auVar85,local_320);
      local_380 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar59 + 0xc + lVar56)));
      auVar77 = vfmadd231ps_avx512vl(auVar77,auVar84,local_380);
      auVar78 = vmulps_avx512vl(_local_360,auVar73);
      auVar78 = vfmadd231ps_avx512vl(auVar78,auVar81,local_340);
      auVar78 = vfmadd231ps_avx512vl(auVar78,auVar72,local_320);
      auVar78 = vfmadd231ps_avx512vl(auVar78,auVar71,local_380);
      auVar79 = vmulps_avx512vl(auVar75,auVar75);
      auVar79 = vfmadd231ps_avx512vl(auVar79,auVar74,auVar74);
      auVar80 = vmaxps_avx512vl(auVar77,auVar78);
      auVar80 = vmulps_avx512vl(auVar80,auVar80);
      auVar79 = vmulps_avx512vl(auVar80,auVar79);
      auVar76 = vmulps_avx512vl(auVar76,auVar76);
      uVar23 = vcmpps_avx512vl(auVar76,auVar79,2);
      auVar68 = vinsertps_avx512f(auVar16,local_380._0_16_,0x30);
      auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar67 = vandps_avx512vl(auVar68,auVar66);
      auVar68 = vblendps_avx(auVar17,local_890,8);
      auVar68 = vandps_avx512vl(auVar68,auVar66);
      auVar67 = vmaxps_avx512vl(auVar67,auVar68);
      auVar68 = vblendps_avx(auVar176,local_8b0,8);
      auVar69 = vandps_avx512vl(auVar68,auVar66);
      auVar68 = vinsertps_avx512f(auVar18,local_360._0_16_,0x30);
      auVar68 = vandps_avx512vl(auVar68,auVar66);
      auVar68 = vmaxps_avx512vl(auVar69,auVar68);
      auVar68 = vmaxps_avx(auVar67,auVar68);
      auVar66 = vmovshdup_avx(auVar68);
      auVar66 = vmaxss_avx(auVar66,auVar68);
      auVar68 = vshufpd_avx(auVar68,auVar68,1);
      auVar68 = vmaxss_avx(auVar68,auVar66);
      auVar79._0_4_ = (float)iVar7;
      local_440._4_12_ = auVar16._4_12_;
      local_440._0_4_ = auVar79._0_4_;
      local_440._16_48_ = auVar122._16_48_;
      auVar79._4_4_ = auVar79._0_4_;
      auVar79._8_4_ = auVar79._0_4_;
      auVar79._12_4_ = auVar79._0_4_;
      auVar79._16_4_ = auVar79._0_4_;
      auVar79._20_4_ = auVar79._0_4_;
      auVar79._24_4_ = auVar79._0_4_;
      auVar79._28_4_ = auVar79._0_4_;
      uVar24 = vcmpps_avx512vl(auVar79,_DAT_01faff40,0xe);
      bVar62 = (byte)uVar23 & (byte)uVar24;
      auVar68 = vmulss_avx512f(auVar68,ZEXT416(0x35000000));
      auVar76._8_4_ = 2;
      auVar76._0_8_ = 0x200000002;
      auVar76._12_4_ = 2;
      auVar76._16_4_ = 2;
      auVar76._20_4_ = 2;
      auVar76._24_4_ = 2;
      auVar76._28_4_ = 2;
      local_460 = vpermps_avx2(auVar76,ZEXT1632(auVar16));
      local_480 = vpermps_avx2(auVar76,ZEXT1632(auVar17));
      local_3a0 = vpermps_avx512vl(auVar76,ZEXT1632(auVar176));
      local_3c0 = vpermps_avx512vl(auVar76,ZEXT1632(auVar18));
      uVar60 = *(uint *)(ray + k * 4 + 0xc0);
      local_6a0 = auVar68._0_4_;
      uStack_69c = auVar68._4_4_;
      uStack_698 = auVar68._8_4_;
      uStack_694 = auVar68._12_4_;
      auVar66 = local_3a0._0_16_;
      if (bVar62 == 0) {
        uVar58 = 0;
        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar175 = ZEXT3264(auVar84);
        auVar68 = vxorps_avx512vl(auVar66,auVar66);
        auVar177 = ZEXT1664(auVar68);
        auVar178 = ZEXT3264(local_780);
        auVar179 = ZEXT3264(local_7a0);
        auVar122 = ZEXT3264(local_8e0);
      }
      else {
        local_7c0._0_16_ = ZEXT416(uVar60);
        auVar73 = vmulps_avx512vl(local_3c0,auVar73);
        auVar81 = vfmadd213ps_avx512vl(auVar81,local_3a0,auVar73);
        auVar72 = vfmadd213ps_avx512vl(auVar72,local_480,auVar81);
        auVar73 = vfmadd213ps_avx512vl(auVar71,local_460,auVar72);
        auVar82 = vmulps_avx512vl(local_3c0,auVar82);
        auVar83 = vfmadd213ps_avx512vl(auVar83,local_3a0,auVar82);
        auVar72 = vfmadd213ps_avx512vl(auVar85,local_480,auVar83);
        auVar85 = *(undefined1 (*) [32])(bezier_basis0 + lVar51 + 0x1210);
        auVar83 = *(undefined1 (*) [32])(bezier_basis0 + lVar51 + 0x1694);
        auVar82 = *(undefined1 (*) [32])(bezier_basis0 + lVar51 + 0x1b18);
        auVar71 = *(undefined1 (*) [32])(bezier_basis0 + lVar51 + 0x1f9c);
        auVar76 = vfmadd213ps_avx512vl(auVar84,local_460,auVar72);
        auVar84 = vmulps_avx512vl(local_860,auVar71);
        auVar72 = vmulps_avx512vl(local_880,auVar71);
        auVar71 = vmulps_avx512vl(local_3c0,auVar71);
        auVar84 = vfmadd231ps_avx512vl(auVar84,auVar82,local_820);
        auVar72 = vfmadd231ps_avx512vl(auVar72,auVar82,local_840);
        auVar82 = vfmadd231ps_avx512vl(auVar71,local_3a0,auVar82);
        auVar176 = vfmadd231ps_fma(auVar84,auVar83,local_8e0);
        auVar84 = vfmadd231ps_avx512vl(auVar72,auVar83,local_800);
        auVar71 = vfmadd231ps_avx512vl(auVar82,local_480,auVar83);
        auVar72 = vfmadd231ps_avx512vl(ZEXT1632(auVar176),auVar85,local_780);
        auVar81 = vfmadd231ps_avx512vl(auVar84,auVar85,local_7a0);
        auVar84 = *(undefined1 (*) [32])(bezier_basis1 + lVar51 + 0x1210);
        auVar83 = *(undefined1 (*) [32])(bezier_basis1 + lVar51 + 0x1b18);
        auVar82 = *(undefined1 (*) [32])(bezier_basis1 + lVar51 + 0x1f9c);
        auVar71 = vfmadd231ps_avx512vl(auVar71,local_460,auVar85);
        auVar85 = vmulps_avx512vl(local_860,auVar82);
        auVar80 = vmulps_avx512vl(local_880,auVar82);
        auVar82 = vmulps_avx512vl(local_3c0,auVar82);
        auVar86 = vfmadd231ps_avx512vl(auVar85,auVar83,local_820);
        auVar80 = vfmadd231ps_avx512vl(auVar80,auVar83,local_840);
        auVar83 = vfmadd231ps_avx512vl(auVar82,local_3a0,auVar83);
        auVar85 = *(undefined1 (*) [32])(bezier_basis1 + lVar51 + 0x1694);
        auVar82 = vfmadd231ps_avx512vl(auVar86,auVar85,local_8e0);
        auVar80 = vfmadd231ps_avx512vl(auVar80,auVar85,local_800);
        auVar85 = vfmadd231ps_avx512vl(auVar83,local_480,auVar85);
        auVar83 = vfmadd231ps_avx512vl(auVar82,auVar84,local_780);
        auVar82 = vfmadd231ps_avx512vl(auVar80,auVar84,local_7a0);
        auVar85 = vfmadd231ps_avx512vl(auVar85,local_460,auVar84);
        auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar72,auVar80);
        vandps_avx512vl(auVar81,auVar80);
        auVar84 = vmaxps_avx(auVar80,auVar80);
        vandps_avx512vl(auVar71,auVar80);
        auVar84 = vmaxps_avx(auVar84,auVar80);
        auVar71 = vbroadcastss_avx512vl(auVar68);
        uVar55 = vcmpps_avx512vl(auVar84,auVar71,1);
        bVar10 = (bool)((byte)uVar55 & 1);
        auVar94._0_4_ = (float)((uint)bVar10 * auVar74._0_4_ | (uint)!bVar10 * auVar72._0_4_);
        bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
        auVar94._4_4_ = (float)((uint)bVar10 * auVar74._4_4_ | (uint)!bVar10 * auVar72._4_4_);
        bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
        auVar94._8_4_ = (float)((uint)bVar10 * auVar74._8_4_ | (uint)!bVar10 * auVar72._8_4_);
        bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
        auVar94._12_4_ = (float)((uint)bVar10 * auVar74._12_4_ | (uint)!bVar10 * auVar72._12_4_);
        bVar10 = (bool)((byte)(uVar55 >> 4) & 1);
        auVar94._16_4_ = (float)((uint)bVar10 * auVar74._16_4_ | (uint)!bVar10 * auVar72._16_4_);
        bVar10 = (bool)((byte)(uVar55 >> 5) & 1);
        auVar94._20_4_ = (float)((uint)bVar10 * auVar74._20_4_ | (uint)!bVar10 * auVar72._20_4_);
        bVar10 = (bool)((byte)(uVar55 >> 6) & 1);
        auVar94._24_4_ = (float)((uint)bVar10 * auVar74._24_4_ | (uint)!bVar10 * auVar72._24_4_);
        bVar10 = SUB81(uVar55 >> 7,0);
        auVar94._28_4_ = (uint)bVar10 * auVar74._28_4_ | (uint)!bVar10 * auVar72._28_4_;
        bVar10 = (bool)((byte)uVar55 & 1);
        auVar95._0_4_ = (float)((uint)bVar10 * auVar75._0_4_ | (uint)!bVar10 * auVar81._0_4_);
        bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
        auVar95._4_4_ = (float)((uint)bVar10 * auVar75._4_4_ | (uint)!bVar10 * auVar81._4_4_);
        bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
        auVar95._8_4_ = (float)((uint)bVar10 * auVar75._8_4_ | (uint)!bVar10 * auVar81._8_4_);
        bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
        auVar95._12_4_ = (float)((uint)bVar10 * auVar75._12_4_ | (uint)!bVar10 * auVar81._12_4_);
        bVar10 = (bool)((byte)(uVar55 >> 4) & 1);
        auVar95._16_4_ = (float)((uint)bVar10 * auVar75._16_4_ | (uint)!bVar10 * auVar81._16_4_);
        bVar10 = (bool)((byte)(uVar55 >> 5) & 1);
        auVar95._20_4_ = (float)((uint)bVar10 * auVar75._20_4_ | (uint)!bVar10 * auVar81._20_4_);
        bVar10 = (bool)((byte)(uVar55 >> 6) & 1);
        auVar95._24_4_ = (float)((uint)bVar10 * auVar75._24_4_ | (uint)!bVar10 * auVar81._24_4_);
        bVar10 = SUB81(uVar55 >> 7,0);
        auVar95._28_4_ = (uint)bVar10 * auVar75._28_4_ | (uint)!bVar10 * auVar81._28_4_;
        vandps_avx512vl(auVar83,auVar80);
        vandps_avx512vl(auVar82,auVar80);
        auVar84 = vmaxps_avx(auVar95,auVar95);
        vandps_avx512vl(auVar85,auVar80);
        auVar84 = vmaxps_avx(auVar84,auVar95);
        uVar55 = vcmpps_avx512vl(auVar84,auVar71,1);
        bVar10 = (bool)((byte)uVar55 & 1);
        auVar96._0_4_ = (float)((uint)bVar10 * auVar74._0_4_ | (uint)!bVar10 * auVar83._0_4_);
        bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
        auVar96._4_4_ = (float)((uint)bVar10 * auVar74._4_4_ | (uint)!bVar10 * auVar83._4_4_);
        bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
        auVar96._8_4_ = (float)((uint)bVar10 * auVar74._8_4_ | (uint)!bVar10 * auVar83._8_4_);
        bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
        auVar96._12_4_ = (float)((uint)bVar10 * auVar74._12_4_ | (uint)!bVar10 * auVar83._12_4_);
        bVar10 = (bool)((byte)(uVar55 >> 4) & 1);
        auVar96._16_4_ = (float)((uint)bVar10 * auVar74._16_4_ | (uint)!bVar10 * auVar83._16_4_);
        bVar10 = (bool)((byte)(uVar55 >> 5) & 1);
        auVar96._20_4_ = (float)((uint)bVar10 * auVar74._20_4_ | (uint)!bVar10 * auVar83._20_4_);
        bVar10 = (bool)((byte)(uVar55 >> 6) & 1);
        auVar96._24_4_ = (float)((uint)bVar10 * auVar74._24_4_ | (uint)!bVar10 * auVar83._24_4_);
        bVar10 = SUB81(uVar55 >> 7,0);
        auVar96._28_4_ = (uint)bVar10 * auVar74._28_4_ | (uint)!bVar10 * auVar83._28_4_;
        bVar10 = (bool)((byte)uVar55 & 1);
        auVar87._0_4_ = (float)((uint)bVar10 * auVar75._0_4_ | (uint)!bVar10 * auVar82._0_4_);
        bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
        auVar87._4_4_ = (float)((uint)bVar10 * auVar75._4_4_ | (uint)!bVar10 * auVar82._4_4_);
        bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
        auVar87._8_4_ = (float)((uint)bVar10 * auVar75._8_4_ | (uint)!bVar10 * auVar82._8_4_);
        bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
        auVar87._12_4_ = (float)((uint)bVar10 * auVar75._12_4_ | (uint)!bVar10 * auVar82._12_4_);
        bVar10 = (bool)((byte)(uVar55 >> 4) & 1);
        auVar87._16_4_ = (float)((uint)bVar10 * auVar75._16_4_ | (uint)!bVar10 * auVar82._16_4_);
        bVar10 = (bool)((byte)(uVar55 >> 5) & 1);
        auVar87._20_4_ = (float)((uint)bVar10 * auVar75._20_4_ | (uint)!bVar10 * auVar82._20_4_);
        bVar10 = (bool)((byte)(uVar55 >> 6) & 1);
        auVar87._24_4_ = (float)((uint)bVar10 * auVar75._24_4_ | (uint)!bVar10 * auVar82._24_4_);
        bVar10 = SUB81(uVar55 >> 7,0);
        auVar87._28_4_ = (uint)bVar10 * auVar75._28_4_ | (uint)!bVar10 * auVar82._28_4_;
        auVar70 = vxorps_avx512vl(auVar66,auVar66);
        auVar177 = ZEXT1664(auVar70);
        auVar84 = vfmadd213ps_avx512vl(auVar94,auVar94,ZEXT1632(auVar70));
        auVar68 = vfmadd231ps_fma(auVar84,auVar95,auVar95);
        auVar83 = vrsqrt14ps_avx512vl(ZEXT1632(auVar68));
        auVar82 = vbroadcastss_avx512vl(ZEXT416(0xbf000000));
        auVar71 = vmulps_avx512vl(ZEXT1632(auVar68),auVar82);
        fVar137 = auVar83._0_4_;
        fVar123 = auVar83._4_4_;
        fVar124 = auVar83._8_4_;
        fVar125 = auVar83._12_4_;
        fVar153 = auVar83._16_4_;
        fVar157 = auVar83._20_4_;
        fVar158 = auVar83._24_4_;
        auVar84._4_4_ = fVar123 * fVar123 * fVar123 * auVar71._4_4_;
        auVar84._0_4_ = fVar137 * fVar137 * fVar137 * auVar71._0_4_;
        auVar84._8_4_ = fVar124 * fVar124 * fVar124 * auVar71._8_4_;
        auVar84._12_4_ = fVar125 * fVar125 * fVar125 * auVar71._12_4_;
        auVar84._16_4_ = fVar153 * fVar153 * fVar153 * auVar71._16_4_;
        auVar84._20_4_ = fVar157 * fVar157 * fVar157 * auVar71._20_4_;
        auVar84._24_4_ = fVar158 * fVar158 * fVar158 * auVar71._24_4_;
        auVar84._28_4_ = auVar85._28_4_;
        auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar84 = vfmadd231ps_avx512vl(auVar84,auVar72,auVar83);
        auVar85._4_4_ = auVar95._4_4_ * auVar84._4_4_;
        auVar85._0_4_ = auVar95._0_4_ * auVar84._0_4_;
        auVar85._8_4_ = auVar95._8_4_ * auVar84._8_4_;
        auVar85._12_4_ = auVar95._12_4_ * auVar84._12_4_;
        auVar85._16_4_ = auVar95._16_4_ * auVar84._16_4_;
        auVar85._20_4_ = auVar95._20_4_ * auVar84._20_4_;
        auVar85._24_4_ = auVar95._24_4_ * auVar84._24_4_;
        auVar85._28_4_ = auVar71._28_4_;
        auVar83._4_4_ = auVar84._4_4_ * -auVar94._4_4_;
        auVar83._0_4_ = auVar84._0_4_ * -auVar94._0_4_;
        auVar83._8_4_ = auVar84._8_4_ * -auVar94._8_4_;
        auVar83._12_4_ = auVar84._12_4_ * -auVar94._12_4_;
        auVar83._16_4_ = auVar84._16_4_ * -auVar94._16_4_;
        auVar83._20_4_ = auVar84._20_4_ * -auVar94._20_4_;
        auVar83._24_4_ = auVar84._24_4_ * -auVar94._24_4_;
        auVar83._28_4_ = auVar95._28_4_;
        auVar71 = vmulps_avx512vl(auVar84,ZEXT1632(auVar70));
        auVar86 = ZEXT1632(auVar70);
        auVar81 = vfmadd213ps_avx512vl(auVar96,auVar96,auVar86);
        auVar68 = vfmadd231ps_fma(auVar81,auVar87,auVar87);
        auVar74 = vrsqrt14ps_avx512vl(ZEXT1632(auVar68));
        auVar81 = vmulps_avx512vl(ZEXT1632(auVar68),auVar82);
        fVar137 = auVar74._0_4_;
        fVar123 = auVar74._4_4_;
        fVar124 = auVar74._8_4_;
        fVar125 = auVar74._12_4_;
        fVar153 = auVar74._16_4_;
        fVar157 = auVar74._20_4_;
        fVar158 = auVar74._24_4_;
        auVar82._4_4_ = fVar123 * fVar123 * fVar123 * auVar81._4_4_;
        auVar82._0_4_ = fVar137 * fVar137 * fVar137 * auVar81._0_4_;
        auVar82._8_4_ = fVar124 * fVar124 * fVar124 * auVar81._8_4_;
        auVar82._12_4_ = fVar125 * fVar125 * fVar125 * auVar81._12_4_;
        auVar82._16_4_ = fVar153 * fVar153 * fVar153 * auVar81._16_4_;
        auVar82._20_4_ = fVar157 * fVar157 * fVar157 * auVar81._20_4_;
        auVar82._24_4_ = fVar158 * fVar158 * fVar158 * auVar81._24_4_;
        auVar82._28_4_ = auVar84._28_4_;
        auVar84 = vfmadd231ps_avx512vl(auVar82,auVar72,auVar74);
        auVar72._4_4_ = auVar87._4_4_ * auVar84._4_4_;
        auVar72._0_4_ = auVar87._0_4_ * auVar84._0_4_;
        auVar72._8_4_ = auVar87._8_4_ * auVar84._8_4_;
        auVar72._12_4_ = auVar87._12_4_ * auVar84._12_4_;
        auVar72._16_4_ = auVar87._16_4_ * auVar84._16_4_;
        auVar72._20_4_ = auVar87._20_4_ * auVar84._20_4_;
        auVar72._24_4_ = auVar87._24_4_ * auVar84._24_4_;
        auVar72._28_4_ = auVar81._28_4_;
        auVar81._4_4_ = auVar84._4_4_ * -auVar96._4_4_;
        auVar81._0_4_ = auVar84._0_4_ * -auVar96._0_4_;
        auVar81._8_4_ = auVar84._8_4_ * -auVar96._8_4_;
        auVar81._12_4_ = auVar84._12_4_ * -auVar96._12_4_;
        auVar81._16_4_ = auVar84._16_4_ * -auVar96._16_4_;
        auVar81._20_4_ = auVar84._20_4_ * -auVar96._20_4_;
        auVar81._24_4_ = auVar84._24_4_ * -auVar96._24_4_;
        auVar81._28_4_ = auVar74._28_4_;
        auVar84 = vmulps_avx512vl(auVar84,auVar86);
        auVar68 = vfmadd213ps_fma(auVar85,auVar77,ZEXT1632(auVar19));
        auVar66 = vfmadd213ps_fma(auVar83,auVar77,ZEXT1632(auVar20));
        auVar82 = vfmadd213ps_avx512vl(auVar71,auVar77,auVar76);
        auVar80 = vfmadd213ps_avx512vl(auVar72,auVar78,ZEXT1632(auVar21));
        auVar67 = vfnmadd213ps_fma(auVar85,auVar77,ZEXT1632(auVar19));
        auVar176 = vfmadd213ps_fma(auVar81,auVar78,ZEXT1632(auVar22));
        auVar20 = vfnmadd213ps_fma(auVar83,auVar77,ZEXT1632(auVar20));
        auVar16 = vfmadd213ps_fma(auVar84,auVar78,auVar73);
        auVar69 = vfnmadd231ps_fma(auVar76,auVar77,auVar71);
        auVar21 = vfnmadd213ps_fma(auVar72,auVar78,ZEXT1632(auVar21));
        auVar22 = vfnmadd213ps_fma(auVar81,auVar78,ZEXT1632(auVar22));
        auVar65 = vfnmadd231ps_fma(auVar73,auVar78,auVar84);
        auVar83 = vsubps_avx512vl(auVar80,ZEXT1632(auVar67));
        auVar84 = vsubps_avx(ZEXT1632(auVar176),ZEXT1632(auVar20));
        auVar85 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar69));
        auVar73._4_4_ = auVar84._4_4_ * auVar69._4_4_;
        auVar73._0_4_ = auVar84._0_4_ * auVar69._0_4_;
        auVar73._8_4_ = auVar84._8_4_ * auVar69._8_4_;
        auVar73._12_4_ = auVar84._12_4_ * auVar69._12_4_;
        auVar73._16_4_ = auVar84._16_4_ * 0.0;
        auVar73._20_4_ = auVar84._20_4_ * 0.0;
        auVar73._24_4_ = auVar84._24_4_ * 0.0;
        auVar73._28_4_ = auVar71._28_4_;
        auVar17 = vfmsub231ps_fma(auVar73,ZEXT1632(auVar20),auVar85);
        auVar74._4_4_ = auVar85._4_4_ * auVar67._4_4_;
        auVar74._0_4_ = auVar85._0_4_ * auVar67._0_4_;
        auVar74._8_4_ = auVar85._8_4_ * auVar67._8_4_;
        auVar74._12_4_ = auVar85._12_4_ * auVar67._12_4_;
        auVar74._16_4_ = auVar85._16_4_ * 0.0;
        auVar74._20_4_ = auVar85._20_4_ * 0.0;
        auVar74._24_4_ = auVar85._24_4_ * 0.0;
        auVar74._28_4_ = auVar85._28_4_;
        auVar18 = vfmsub231ps_fma(auVar74,ZEXT1632(auVar69),auVar83);
        auVar75._4_4_ = auVar20._4_4_ * auVar83._4_4_;
        auVar75._0_4_ = auVar20._0_4_ * auVar83._0_4_;
        auVar75._8_4_ = auVar20._8_4_ * auVar83._8_4_;
        auVar75._12_4_ = auVar20._12_4_ * auVar83._12_4_;
        auVar75._16_4_ = auVar83._16_4_ * 0.0;
        auVar75._20_4_ = auVar83._20_4_ * 0.0;
        auVar75._24_4_ = auVar83._24_4_ * 0.0;
        auVar75._28_4_ = auVar83._28_4_;
        auVar19 = vfmsub231ps_fma(auVar75,ZEXT1632(auVar67),auVar84);
        auVar84 = vfmadd231ps_avx512vl(ZEXT1632(auVar19),auVar86,ZEXT1632(auVar18));
        auVar84 = vfmadd231ps_avx512vl(auVar84,auVar86,ZEXT1632(auVar17));
        auVar94 = ZEXT1632(auVar70);
        uVar55 = vcmpps_avx512vl(auVar84,auVar94,2);
        bVar54 = (byte)uVar55;
        fVar63 = (float)((uint)(bVar54 & 1) * auVar68._0_4_ |
                        (uint)!(bool)(bVar54 & 1) * auVar21._0_4_);
        bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
        fVar109 = (float)((uint)bVar10 * auVar68._4_4_ | (uint)!bVar10 * auVar21._4_4_);
        bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
        fVar111 = (float)((uint)bVar10 * auVar68._8_4_ | (uint)!bVar10 * auVar21._8_4_);
        bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
        fVar113 = (float)((uint)bVar10 * auVar68._12_4_ | (uint)!bVar10 * auVar21._12_4_);
        auVar81 = ZEXT1632(CONCAT412(fVar113,CONCAT48(fVar111,CONCAT44(fVar109,fVar63))));
        fVar64 = (float)((uint)(bVar54 & 1) * auVar66._0_4_ |
                        (uint)!(bool)(bVar54 & 1) * auVar22._0_4_);
        bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
        fVar110 = (float)((uint)bVar10 * auVar66._4_4_ | (uint)!bVar10 * auVar22._4_4_);
        bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
        fVar112 = (float)((uint)bVar10 * auVar66._8_4_ | (uint)!bVar10 * auVar22._8_4_);
        bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
        fVar114 = (float)((uint)bVar10 * auVar66._12_4_ | (uint)!bVar10 * auVar22._12_4_);
        auVar73 = ZEXT1632(CONCAT412(fVar114,CONCAT48(fVar112,CONCAT44(fVar110,fVar64))));
        auVar88._0_4_ =
             (float)((uint)(bVar54 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar65._0_4_)
        ;
        bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
        auVar88._4_4_ = (float)((uint)bVar10 * auVar82._4_4_ | (uint)!bVar10 * auVar65._4_4_);
        bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
        auVar88._8_4_ = (float)((uint)bVar10 * auVar82._8_4_ | (uint)!bVar10 * auVar65._8_4_);
        bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
        auVar88._12_4_ = (float)((uint)bVar10 * auVar82._12_4_ | (uint)!bVar10 * auVar65._12_4_);
        fVar137 = (float)((uint)((byte)(uVar55 >> 4) & 1) * auVar82._16_4_);
        auVar88._16_4_ = fVar137;
        fVar123 = (float)((uint)((byte)(uVar55 >> 5) & 1) * auVar82._20_4_);
        auVar88._20_4_ = fVar123;
        fVar124 = (float)((uint)((byte)(uVar55 >> 6) & 1) * auVar82._24_4_);
        auVar88._24_4_ = fVar124;
        iVar1 = (uint)(byte)(uVar55 >> 7) * auVar82._28_4_;
        auVar88._28_4_ = iVar1;
        auVar84 = vblendmps_avx512vl(ZEXT1632(auVar67),auVar80);
        auVar89._0_4_ =
             (uint)(bVar54 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar68._0_4_;
        bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
        auVar89._4_4_ = (uint)bVar10 * auVar84._4_4_ | (uint)!bVar10 * auVar68._4_4_;
        bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
        auVar89._8_4_ = (uint)bVar10 * auVar84._8_4_ | (uint)!bVar10 * auVar68._8_4_;
        bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
        auVar89._12_4_ = (uint)bVar10 * auVar84._12_4_ | (uint)!bVar10 * auVar68._12_4_;
        auVar89._16_4_ = (uint)((byte)(uVar55 >> 4) & 1) * auVar84._16_4_;
        auVar89._20_4_ = (uint)((byte)(uVar55 >> 5) & 1) * auVar84._20_4_;
        auVar89._24_4_ = (uint)((byte)(uVar55 >> 6) & 1) * auVar84._24_4_;
        auVar89._28_4_ = (uint)(byte)(uVar55 >> 7) * auVar84._28_4_;
        auVar84 = vblendmps_avx512vl(ZEXT1632(auVar20),ZEXT1632(auVar176));
        auVar90._0_4_ =
             (float)((uint)(bVar54 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar17._0_4_)
        ;
        bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
        auVar90._4_4_ = (float)((uint)bVar10 * auVar84._4_4_ | (uint)!bVar10 * auVar17._4_4_);
        bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
        auVar90._8_4_ = (float)((uint)bVar10 * auVar84._8_4_ | (uint)!bVar10 * auVar17._8_4_);
        bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
        auVar90._12_4_ = (float)((uint)bVar10 * auVar84._12_4_ | (uint)!bVar10 * auVar17._12_4_);
        fVar125 = (float)((uint)((byte)(uVar55 >> 4) & 1) * auVar84._16_4_);
        auVar90._16_4_ = fVar125;
        fVar153 = (float)((uint)((byte)(uVar55 >> 5) & 1) * auVar84._20_4_);
        auVar90._20_4_ = fVar153;
        fVar157 = (float)((uint)((byte)(uVar55 >> 6) & 1) * auVar84._24_4_);
        auVar90._24_4_ = fVar157;
        auVar90._28_4_ = (uint)(byte)(uVar55 >> 7) * auVar84._28_4_;
        auVar84 = vblendmps_avx512vl(ZEXT1632(auVar69),ZEXT1632(auVar16));
        auVar91._0_4_ =
             (float)((uint)(bVar54 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar66._0_4_)
        ;
        bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
        auVar91._4_4_ = (float)((uint)bVar10 * auVar84._4_4_ | (uint)!bVar10 * auVar66._4_4_);
        bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
        auVar91._8_4_ = (float)((uint)bVar10 * auVar84._8_4_ | (uint)!bVar10 * auVar66._8_4_);
        bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
        auVar91._12_4_ = (float)((uint)bVar10 * auVar84._12_4_ | (uint)!bVar10 * auVar66._12_4_);
        fVar160 = (float)((uint)((byte)(uVar55 >> 4) & 1) * auVar84._16_4_);
        auVar91._16_4_ = fVar160;
        fVar158 = (float)((uint)((byte)(uVar55 >> 5) & 1) * auVar84._20_4_);
        auVar91._20_4_ = fVar158;
        fVar159 = (float)((uint)((byte)(uVar55 >> 6) & 1) * auVar84._24_4_);
        auVar91._24_4_ = fVar159;
        iVar2 = (uint)(byte)(uVar55 >> 7) * auVar84._28_4_;
        auVar91._28_4_ = iVar2;
        auVar92._0_4_ =
             (uint)(bVar54 & 1) * (int)auVar67._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar80._0_4_;
        bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
        auVar92._4_4_ = (uint)bVar10 * (int)auVar67._4_4_ | (uint)!bVar10 * auVar80._4_4_;
        bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
        auVar92._8_4_ = (uint)bVar10 * (int)auVar67._8_4_ | (uint)!bVar10 * auVar80._8_4_;
        bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
        auVar92._12_4_ = (uint)bVar10 * (int)auVar67._12_4_ | (uint)!bVar10 * auVar80._12_4_;
        auVar92._16_4_ = (uint)!(bool)((byte)(uVar55 >> 4) & 1) * auVar80._16_4_;
        auVar92._20_4_ = (uint)!(bool)((byte)(uVar55 >> 5) & 1) * auVar80._20_4_;
        auVar92._24_4_ = (uint)!(bool)((byte)(uVar55 >> 6) & 1) * auVar80._24_4_;
        auVar92._28_4_ = (uint)!SUB81(uVar55 >> 7,0) * auVar80._28_4_;
        bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
        bVar12 = (bool)((byte)(uVar55 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar55 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar55 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar55 >> 3) & 1);
        auVar74 = vsubps_avx512vl(auVar92,auVar81);
        auVar85 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar20._12_4_ |
                                                (uint)!bVar14 * auVar176._12_4_,
                                                CONCAT48((uint)bVar12 * (int)auVar20._8_4_ |
                                                         (uint)!bVar12 * auVar176._8_4_,
                                                         CONCAT44((uint)bVar10 * (int)auVar20._4_4_
                                                                  | (uint)!bVar10 * auVar176._4_4_,
                                                                  (uint)(bVar54 & 1) *
                                                                  (int)auVar20._0_4_ |
                                                                  (uint)!(bool)(bVar54 & 1) *
                                                                  auVar176._0_4_)))),auVar73);
        auVar83 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar69._12_4_ |
                                                (uint)!bVar15 * auVar16._12_4_,
                                                CONCAT48((uint)bVar13 * (int)auVar69._8_4_ |
                                                         (uint)!bVar13 * auVar16._8_4_,
                                                         CONCAT44((uint)bVar11 * (int)auVar69._4_4_
                                                                  | (uint)!bVar11 * auVar16._4_4_,
                                                                  (uint)(bVar54 & 1) *
                                                                  (int)auVar69._0_4_ |
                                                                  (uint)!(bool)(bVar54 & 1) *
                                                                  auVar16._0_4_)))),auVar88);
        auVar82 = vsubps_avx(auVar81,auVar89);
        auVar71 = vsubps_avx(auVar73,auVar90);
        auVar72 = vsubps_avx(auVar88,auVar91);
        auVar80._4_4_ = auVar83._4_4_ * fVar109;
        auVar80._0_4_ = auVar83._0_4_ * fVar63;
        auVar80._8_4_ = auVar83._8_4_ * fVar111;
        auVar80._12_4_ = auVar83._12_4_ * fVar113;
        auVar80._16_4_ = auVar83._16_4_ * 0.0;
        auVar80._20_4_ = auVar83._20_4_ * 0.0;
        auVar80._24_4_ = auVar83._24_4_ * 0.0;
        auVar80._28_4_ = 0;
        auVar68 = vfmsub231ps_fma(auVar80,auVar88,auVar74);
        auVar142._0_4_ = fVar64 * auVar74._0_4_;
        auVar142._4_4_ = fVar110 * auVar74._4_4_;
        auVar142._8_4_ = fVar112 * auVar74._8_4_;
        auVar142._12_4_ = fVar114 * auVar74._12_4_;
        auVar142._16_4_ = auVar74._16_4_ * 0.0;
        auVar142._20_4_ = auVar74._20_4_ * 0.0;
        auVar142._24_4_ = auVar74._24_4_ * 0.0;
        auVar142._28_4_ = 0;
        auVar66 = vfmsub231ps_fma(auVar142,auVar81,auVar85);
        auVar84 = vfmadd231ps_avx512vl(ZEXT1632(auVar66),auVar94,ZEXT1632(auVar68));
        auVar146._0_4_ = auVar85._0_4_ * auVar88._0_4_;
        auVar146._4_4_ = auVar85._4_4_ * auVar88._4_4_;
        auVar146._8_4_ = auVar85._8_4_ * auVar88._8_4_;
        auVar146._12_4_ = auVar85._12_4_ * auVar88._12_4_;
        auVar146._16_4_ = auVar85._16_4_ * fVar137;
        auVar146._20_4_ = auVar85._20_4_ * fVar123;
        auVar146._24_4_ = auVar85._24_4_ * fVar124;
        auVar146._28_4_ = 0;
        auVar68 = vfmsub231ps_fma(auVar146,auVar73,auVar83);
        auVar75 = vfmadd231ps_avx512vl(auVar84,auVar94,ZEXT1632(auVar68));
        auVar84 = vmulps_avx512vl(auVar72,auVar89);
        auVar84 = vfmsub231ps_avx512vl(auVar84,auVar82,auVar91);
        auVar86._4_4_ = auVar71._4_4_ * auVar91._4_4_;
        auVar86._0_4_ = auVar71._0_4_ * auVar91._0_4_;
        auVar86._8_4_ = auVar71._8_4_ * auVar91._8_4_;
        auVar86._12_4_ = auVar71._12_4_ * auVar91._12_4_;
        auVar86._16_4_ = auVar71._16_4_ * fVar160;
        auVar86._20_4_ = auVar71._20_4_ * fVar158;
        auVar86._24_4_ = auVar71._24_4_ * fVar159;
        auVar86._28_4_ = iVar2;
        auVar68 = vfmsub231ps_fma(auVar86,auVar90,auVar72);
        auVar147._0_4_ = auVar90._0_4_ * auVar82._0_4_;
        auVar147._4_4_ = auVar90._4_4_ * auVar82._4_4_;
        auVar147._8_4_ = auVar90._8_4_ * auVar82._8_4_;
        auVar147._12_4_ = auVar90._12_4_ * auVar82._12_4_;
        auVar147._16_4_ = fVar125 * auVar82._16_4_;
        auVar147._20_4_ = fVar153 * auVar82._20_4_;
        auVar147._24_4_ = fVar157 * auVar82._24_4_;
        auVar147._28_4_ = 0;
        auVar66 = vfmsub231ps_fma(auVar147,auVar71,auVar89);
        auVar84 = vfmadd231ps_avx512vl(ZEXT1632(auVar66),auVar94,auVar84);
        auVar76 = vfmadd231ps_avx512vl(auVar84,auVar94,ZEXT1632(auVar68));
        auVar84 = vmaxps_avx(auVar75,auVar76);
        uVar23 = vcmpps_avx512vl(auVar84,auVar94,2);
        bVar62 = bVar62 & (byte)uVar23;
        auVar178 = ZEXT3264(local_780);
        auVar179 = ZEXT3264(local_7a0);
        auVar122 = ZEXT3264(local_8e0);
        if (bVar62 == 0) {
          uVar58 = 0;
          auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar175 = ZEXT3264(auVar84);
          auVar180 = ZEXT3264(local_800);
          auVar182 = ZEXT3264(local_820);
          auVar181 = ZEXT3264(local_840);
          auVar183 = ZEXT3264(local_860);
          auVar184 = ZEXT3264(local_880);
        }
        else {
          uVar115 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar169._4_4_ = uVar115;
          auVar169._0_4_ = uVar115;
          auVar169._8_4_ = uVar115;
          auVar169._12_4_ = uVar115;
          auVar169._16_4_ = uVar115;
          auVar169._20_4_ = uVar115;
          auVar169._24_4_ = uVar115;
          auVar169._28_4_ = uVar115;
          auVar171 = ZEXT3264(auVar169);
          auVar28._4_4_ = auVar72._4_4_ * auVar85._4_4_;
          auVar28._0_4_ = auVar72._0_4_ * auVar85._0_4_;
          auVar28._8_4_ = auVar72._8_4_ * auVar85._8_4_;
          auVar28._12_4_ = auVar72._12_4_ * auVar85._12_4_;
          auVar28._16_4_ = auVar72._16_4_ * auVar85._16_4_;
          auVar28._20_4_ = auVar72._20_4_ * auVar85._20_4_;
          auVar28._24_4_ = auVar72._24_4_ * auVar85._24_4_;
          auVar28._28_4_ = auVar84._28_4_;
          auVar176 = vfmsub231ps_fma(auVar28,auVar71,auVar83);
          auVar29._4_4_ = auVar83._4_4_ * auVar82._4_4_;
          auVar29._0_4_ = auVar83._0_4_ * auVar82._0_4_;
          auVar29._8_4_ = auVar83._8_4_ * auVar82._8_4_;
          auVar29._12_4_ = auVar83._12_4_ * auVar82._12_4_;
          auVar29._16_4_ = auVar83._16_4_ * auVar82._16_4_;
          auVar29._20_4_ = auVar83._20_4_ * auVar82._20_4_;
          auVar29._24_4_ = auVar83._24_4_ * auVar82._24_4_;
          auVar29._28_4_ = auVar83._28_4_;
          auVar66 = vfmsub231ps_fma(auVar29,auVar74,auVar72);
          auVar30._4_4_ = auVar71._4_4_ * auVar74._4_4_;
          auVar30._0_4_ = auVar71._0_4_ * auVar74._0_4_;
          auVar30._8_4_ = auVar71._8_4_ * auVar74._8_4_;
          auVar30._12_4_ = auVar71._12_4_ * auVar74._12_4_;
          auVar30._16_4_ = auVar71._16_4_ * auVar74._16_4_;
          auVar30._20_4_ = auVar71._20_4_ * auVar74._20_4_;
          auVar30._24_4_ = auVar71._24_4_ * auVar74._24_4_;
          auVar30._28_4_ = auVar71._28_4_;
          auVar16 = vfmsub231ps_fma(auVar30,auVar82,auVar85);
          auVar68 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar66),ZEXT1632(auVar16));
          auVar84 = vfmadd231ps_avx512vl(ZEXT1632(auVar68),ZEXT1632(auVar176),auVar94);
          auVar85 = vrcp14ps_avx512vl(auVar84);
          auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar175 = ZEXT3264(auVar83);
          auVar82 = vfnmadd213ps_avx512vl(auVar85,auVar84,auVar83);
          auVar68 = vfmadd132ps_fma(auVar82,auVar85,auVar85);
          auVar31._4_4_ = auVar16._4_4_ * auVar88._4_4_;
          auVar31._0_4_ = auVar16._0_4_ * auVar88._0_4_;
          auVar31._8_4_ = auVar16._8_4_ * auVar88._8_4_;
          auVar31._12_4_ = auVar16._12_4_ * auVar88._12_4_;
          auVar31._16_4_ = fVar137 * 0.0;
          auVar31._20_4_ = fVar123 * 0.0;
          auVar31._24_4_ = fVar124 * 0.0;
          auVar31._28_4_ = iVar1;
          auVar66 = vfmadd231ps_fma(auVar31,auVar73,ZEXT1632(auVar66));
          auVar66 = vfmadd231ps_fma(ZEXT1632(auVar66),auVar81,ZEXT1632(auVar176));
          fVar137 = auVar68._0_4_;
          fVar123 = auVar68._4_4_;
          fVar124 = auVar68._8_4_;
          fVar125 = auVar68._12_4_;
          local_620 = ZEXT1632(CONCAT412(auVar66._12_4_ * fVar125,
                                         CONCAT48(auVar66._8_4_ * fVar124,
                                                  CONCAT44(auVar66._4_4_ * fVar123,
                                                           auVar66._0_4_ * fVar137))));
          auVar162._4_4_ = uVar60;
          auVar162._0_4_ = uVar60;
          auVar162._8_4_ = uVar60;
          auVar162._12_4_ = uVar60;
          auVar162._16_4_ = uVar60;
          auVar162._20_4_ = uVar60;
          auVar162._24_4_ = uVar60;
          auVar162._28_4_ = uVar60;
          uVar23 = vcmpps_avx512vl(local_620,auVar169,2);
          uVar24 = vcmpps_avx512vl(auVar162,local_620,2);
          bVar62 = (byte)uVar23 & (byte)uVar24 & bVar62;
          auVar180 = ZEXT3264(local_800);
          auVar182 = ZEXT3264(local_820);
          auVar181 = ZEXT3264(local_840);
          auVar183 = ZEXT3264(local_860);
          auVar184 = ZEXT3264(local_880);
          if (bVar62 != 0) {
            uVar23 = vcmpps_avx512vl(auVar84,auVar94,4);
            bVar62 = bVar62 & (byte)uVar23;
            if (bVar62 != 0) {
              fVar153 = auVar75._0_4_ * fVar137;
              fVar157 = auVar75._4_4_ * fVar123;
              auVar32._4_4_ = fVar157;
              auVar32._0_4_ = fVar153;
              fVar158 = auVar75._8_4_ * fVar124;
              auVar32._8_4_ = fVar158;
              fVar159 = auVar75._12_4_ * fVar125;
              auVar32._12_4_ = fVar159;
              fVar160 = auVar75._16_4_ * 0.0;
              auVar32._16_4_ = fVar160;
              fVar63 = auVar75._20_4_ * 0.0;
              auVar32._20_4_ = fVar63;
              fVar64 = auVar75._24_4_ * 0.0;
              auVar32._24_4_ = fVar64;
              auVar32._28_4_ = auVar84._28_4_;
              auVar85 = vsubps_avx512vl(auVar83,auVar32);
              local_660._0_4_ =
                   (float)((uint)(bVar54 & 1) * (int)fVar153 |
                          (uint)!(bool)(bVar54 & 1) * auVar85._0_4_);
              bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
              local_660._4_4_ = (float)((uint)bVar10 * (int)fVar157 | (uint)!bVar10 * auVar85._4_4_)
              ;
              bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
              local_660._8_4_ = (float)((uint)bVar10 * (int)fVar158 | (uint)!bVar10 * auVar85._8_4_)
              ;
              bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
              local_660._12_4_ =
                   (float)((uint)bVar10 * (int)fVar159 | (uint)!bVar10 * auVar85._12_4_);
              bVar10 = (bool)((byte)(uVar55 >> 4) & 1);
              local_660._16_4_ =
                   (float)((uint)bVar10 * (int)fVar160 | (uint)!bVar10 * auVar85._16_4_);
              bVar10 = (bool)((byte)(uVar55 >> 5) & 1);
              local_660._20_4_ =
                   (float)((uint)bVar10 * (int)fVar63 | (uint)!bVar10 * auVar85._20_4_);
              bVar10 = (bool)((byte)(uVar55 >> 6) & 1);
              local_660._24_4_ =
                   (float)((uint)bVar10 * (int)fVar64 | (uint)!bVar10 * auVar85._24_4_);
              bVar10 = SUB81(uVar55 >> 7,0);
              local_660._28_4_ =
                   (float)((uint)bVar10 * auVar84._28_4_ | (uint)!bVar10 * auVar85._28_4_);
              auVar84 = vsubps_avx(auVar78,auVar77);
              auVar68 = vfmadd213ps_fma(auVar84,local_660,auVar77);
              uVar115 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar77._4_4_ = uVar115;
              auVar77._0_4_ = uVar115;
              auVar77._8_4_ = uVar115;
              auVar77._12_4_ = uVar115;
              auVar77._16_4_ = uVar115;
              auVar77._20_4_ = uVar115;
              auVar77._24_4_ = uVar115;
              auVar77._28_4_ = uVar115;
              auVar84 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar68._12_4_ + auVar68._12_4_,
                                                           CONCAT48(auVar68._8_4_ + auVar68._8_4_,
                                                                    CONCAT44(auVar68._4_4_ +
                                                                             auVar68._4_4_,
                                                                             auVar68._0_4_ +
                                                                             auVar68._0_4_)))),
                                        auVar77);
              uVar23 = vcmpps_avx512vl(local_620,auVar84,6);
              if (((byte)uVar23 & bVar62) != 0) {
                auVar136._0_4_ = auVar76._0_4_ * fVar137;
                auVar136._4_4_ = auVar76._4_4_ * fVar123;
                auVar136._8_4_ = auVar76._8_4_ * fVar124;
                auVar136._12_4_ = auVar76._12_4_ * fVar125;
                auVar136._16_4_ = auVar76._16_4_ * 0.0;
                auVar136._20_4_ = auVar76._20_4_ * 0.0;
                auVar136._24_4_ = auVar76._24_4_ * 0.0;
                auVar136._28_4_ = 0;
                auVar84 = vsubps_avx512vl(auVar83,auVar136);
                auVar93._0_4_ =
                     (uint)(bVar54 & 1) * (int)auVar136._0_4_ |
                     (uint)!(bool)(bVar54 & 1) * auVar84._0_4_;
                bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
                auVar93._4_4_ = (uint)bVar10 * (int)auVar136._4_4_ | (uint)!bVar10 * auVar84._4_4_;
                bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
                auVar93._8_4_ = (uint)bVar10 * (int)auVar136._8_4_ | (uint)!bVar10 * auVar84._8_4_;
                bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
                auVar93._12_4_ =
                     (uint)bVar10 * (int)auVar136._12_4_ | (uint)!bVar10 * auVar84._12_4_;
                bVar10 = (bool)((byte)(uVar55 >> 4) & 1);
                auVar93._16_4_ =
                     (uint)bVar10 * (int)auVar136._16_4_ | (uint)!bVar10 * auVar84._16_4_;
                bVar10 = (bool)((byte)(uVar55 >> 5) & 1);
                auVar93._20_4_ =
                     (uint)bVar10 * (int)auVar136._20_4_ | (uint)!bVar10 * auVar84._20_4_;
                bVar10 = (bool)((byte)(uVar55 >> 6) & 1);
                auVar93._24_4_ =
                     (uint)bVar10 * (int)auVar136._24_4_ | (uint)!bVar10 * auVar84._24_4_;
                auVar93._28_4_ = (uint)!SUB81(uVar55 >> 7,0) * auVar84._28_4_;
                auVar78._8_4_ = 0x40000000;
                auVar78._0_8_ = 0x4000000040000000;
                auVar78._12_4_ = 0x40000000;
                auVar78._16_4_ = 0x40000000;
                auVar78._20_4_ = 0x40000000;
                auVar78._24_4_ = 0x40000000;
                auVar78._28_4_ = 0x40000000;
                local_640 = vfmsub132ps_avx512vl(auVar93,auVar83,auVar78);
                local_600 = 0;
                local_5f0 = local_8a0._0_8_;
                uStack_5e8 = local_8a0._8_8_;
                local_5e0 = local_890._0_8_;
                uStack_5d8 = local_890._8_8_;
                local_5d0 = local_8b0._0_8_;
                uStack_5c8 = local_8b0._8_8_;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (uVar58 = CONCAT71((int7)(uVar58 >> 8),1),
                     pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar137 = 1.0 / auVar79._0_4_;
                    local_5a0[0] = fVar137 * (local_660._0_4_ + 0.0);
                    local_5a0[1] = fVar137 * (local_660._4_4_ + 1.0);
                    local_5a0[2] = fVar137 * (local_660._8_4_ + 2.0);
                    local_5a0[3] = fVar137 * (local_660._12_4_ + 3.0);
                    fStack_590 = fVar137 * (local_660._16_4_ + 4.0);
                    fStack_58c = fVar137 * (local_660._20_4_ + 5.0);
                    fStack_588 = fVar137 * (local_660._24_4_ + 6.0);
                    fStack_584 = local_660._28_4_ + 7.0;
                    local_580 = local_640;
                    local_560 = local_620;
                    lVar59 = 0;
                    local_720 = (ulong)((byte)uVar23 & bVar62);
                    for (uVar55 = local_720; (uVar55 & 1) == 0;
                        uVar55 = uVar55 >> 1 | 0x8000000000000000) {
                      lVar59 = lVar59 + 1;
                    }
                    auVar175 = vpbroadcastd_avx512f();
                    local_500 = vmovdqa64_avx512f(auVar175);
                    auVar175 = vpbroadcastd_avx512f();
                    local_540 = vmovdqa64_avx512f(auVar175);
                    local_760 = auVar169;
                    local_5fc = iVar7;
                    do {
                      auVar176 = auVar177._0_16_;
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_5a0[lVar59]));
                      local_6c0 = (uint)lVar59;
                      uStack_6bc = (uint)((ulong)lVar59 >> 0x20);
                      local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_580 + lVar59 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_560 + lVar59 * 4)
                      ;
                      local_910.context = context->user;
                      fVar125 = local_200._0_4_;
                      fVar123 = 1.0 - fVar125;
                      fVar137 = fVar123 * fVar123 * -3.0;
                      auVar68 = vfmadd231ss_fma(ZEXT416((uint)(fVar123 * fVar123)),
                                                ZEXT416((uint)(fVar125 * fVar123)),
                                                ZEXT416(0xc0000000));
                      auVar66 = vfmsub132ss_fma(ZEXT416((uint)(fVar125 * fVar123)),
                                                ZEXT416((uint)(fVar125 * fVar125)),
                                                ZEXT416(0x40000000));
                      fVar123 = auVar68._0_4_ * 3.0;
                      fVar124 = auVar66._0_4_ * 3.0;
                      fVar125 = fVar125 * fVar125 * 3.0;
                      auVar151._0_4_ = fVar125 * (float)local_730._0_4_;
                      auVar151._4_4_ = fVar125 * (float)local_730._4_4_;
                      auVar151._8_4_ = fVar125 * fStack_728;
                      auVar151._12_4_ = fVar125 * fStack_724;
                      auVar118._4_4_ = fVar124;
                      auVar118._0_4_ = fVar124;
                      auVar118._8_4_ = fVar124;
                      auVar118._12_4_ = fVar124;
                      auVar68 = vfmadd132ps_fma(auVar118,auVar151,local_8b0);
                      auVar140._4_4_ = fVar123;
                      auVar140._0_4_ = fVar123;
                      auVar140._8_4_ = fVar123;
                      auVar140._12_4_ = fVar123;
                      auVar68 = vfmadd132ps_fma(auVar140,auVar68,local_890);
                      auVar119._4_4_ = fVar137;
                      auVar119._0_4_ = fVar137;
                      auVar119._8_4_ = fVar137;
                      auVar119._12_4_ = fVar137;
                      auVar68 = vfmadd132ps_fma(auVar119,auVar68,local_8a0);
                      auVar175 = vbroadcastss_avx512f(auVar68);
                      auVar107 = vbroadcastss_avx512f(ZEXT416(1));
                      local_280 = vpermps_avx512f(auVar107,ZEXT1664(auVar68));
                      auVar107 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar107,ZEXT1664(auVar68));
                      local_2c0[0] = (RTCHitN)auVar175[0];
                      local_2c0[1] = (RTCHitN)auVar175[1];
                      local_2c0[2] = (RTCHitN)auVar175[2];
                      local_2c0[3] = (RTCHitN)auVar175[3];
                      local_2c0[4] = (RTCHitN)auVar175[4];
                      local_2c0[5] = (RTCHitN)auVar175[5];
                      local_2c0[6] = (RTCHitN)auVar175[6];
                      local_2c0[7] = (RTCHitN)auVar175[7];
                      local_2c0[8] = (RTCHitN)auVar175[8];
                      local_2c0[9] = (RTCHitN)auVar175[9];
                      local_2c0[10] = (RTCHitN)auVar175[10];
                      local_2c0[0xb] = (RTCHitN)auVar175[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar175[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar175[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar175[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar175[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar175[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar175[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar175[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar175[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar175[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar175[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar175[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar175[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar175[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar175[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar175[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar175[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar175[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar175[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar175[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar175[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar175[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar175[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar175[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar175[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar175[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar175[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar175[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar175[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar175[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar175[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar175[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar175[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar175[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar175[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar175[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar175[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar175[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar175[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar175[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar175[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar175[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar175[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar175[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar175[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar175[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar175[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar175[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar175[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar175[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar175[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar175[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar175[0x3f];
                      local_180 = local_540._0_8_;
                      uStack_178 = local_540._8_8_;
                      uStack_170 = local_540._16_8_;
                      uStack_168 = local_540._24_8_;
                      uStack_160 = local_540._32_8_;
                      uStack_158 = local_540._40_8_;
                      uStack_150 = local_540._48_8_;
                      uStack_148 = local_540._56_8_;
                      auVar175 = vmovdqa64_avx512f(local_500);
                      local_140 = vmovdqa64_avx512f(auVar175);
                      vpcmpeqd_avx2(auVar175._0_32_,auVar175._0_32_);
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instPrimID[0]));
                      auVar107 = vmovdqa64_avx512f(local_300);
                      local_700 = vmovdqa64_avx512f(auVar107);
                      local_910.valid = (int *)local_700;
                      local_910.geometryUserPtr = pGVar8->userPtr;
                      local_910.hit = local_2c0;
                      local_910.N = 0x10;
                      local_910.ray = (RTCRayN *)ray;
                      if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar8->occlusionFilterN)(&local_910);
                        auVar171 = ZEXT3264(local_760);
                        auVar184 = ZEXT3264(local_880);
                        auVar183 = ZEXT3264(local_860);
                        auVar181 = ZEXT3264(local_840);
                        auVar182 = ZEXT3264(local_820);
                        auVar180 = ZEXT3264(local_800);
                        auVar122 = ZEXT3264(local_8e0);
                        auVar179 = ZEXT3264(local_7a0);
                        auVar178 = ZEXT3264(local_780);
                        auVar68 = vxorps_avx512vl(auVar176,auVar176);
                        auVar177 = ZEXT1664(auVar68);
                        auVar107 = vmovdqa64_avx512f(local_700);
                        uVar60 = local_7c0._0_4_;
                      }
                      auVar68 = auVar177._0_16_;
                      uVar23 = vptestmd_avx512f(auVar107,auVar107);
                      if ((short)uVar23 == 0) {
                        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar175 = ZEXT3264(auVar84);
                      }
                      else {
                        p_Var9 = context->args->filter;
                        if (p_Var9 == (RTCFilterFunctionN)0x0) {
                          auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar175 = ZEXT3264(auVar84);
                        }
                        else {
                          auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar175 = ZEXT3264(auVar84);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var9)(&local_910);
                            auVar171 = ZEXT3264(local_760);
                            auVar184 = ZEXT3264(local_880);
                            auVar183 = ZEXT3264(local_860);
                            auVar181 = ZEXT3264(local_840);
                            auVar182 = ZEXT3264(local_820);
                            auVar180 = ZEXT3264(local_800);
                            auVar122 = ZEXT3264(local_8e0);
                            auVar179 = ZEXT3264(local_7a0);
                            auVar178 = ZEXT3264(local_780);
                            auVar68 = vxorps_avx512vl(auVar68,auVar68);
                            auVar177 = ZEXT1664(auVar68);
                            auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar175 = ZEXT3264(auVar84);
                            auVar107 = vmovdqa64_avx512f(local_700);
                            uVar60 = local_7c0._0_4_;
                          }
                        }
                        uVar55 = vptestmd_avx512f(auVar107,auVar107);
                        auVar107 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar10 = (bool)((byte)uVar55 & 1);
                        auVar108._0_4_ =
                             (uint)bVar10 * auVar107._0_4_ |
                             (uint)!bVar10 * *(int *)(local_910.ray + 0x200);
                        bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
                        auVar108._4_4_ =
                             (uint)bVar10 * auVar107._4_4_ |
                             (uint)!bVar10 * *(int *)(local_910.ray + 0x204);
                        bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
                        auVar108._8_4_ =
                             (uint)bVar10 * auVar107._8_4_ |
                             (uint)!bVar10 * *(int *)(local_910.ray + 0x208);
                        bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
                        auVar108._12_4_ =
                             (uint)bVar10 * auVar107._12_4_ |
                             (uint)!bVar10 * *(int *)(local_910.ray + 0x20c);
                        bVar10 = (bool)((byte)(uVar55 >> 4) & 1);
                        auVar108._16_4_ =
                             (uint)bVar10 * auVar107._16_4_ |
                             (uint)!bVar10 * *(int *)(local_910.ray + 0x210);
                        bVar10 = (bool)((byte)(uVar55 >> 5) & 1);
                        auVar108._20_4_ =
                             (uint)bVar10 * auVar107._20_4_ |
                             (uint)!bVar10 * *(int *)(local_910.ray + 0x214);
                        bVar10 = (bool)((byte)(uVar55 >> 6) & 1);
                        auVar108._24_4_ =
                             (uint)bVar10 * auVar107._24_4_ |
                             (uint)!bVar10 * *(int *)(local_910.ray + 0x218);
                        bVar10 = (bool)((byte)(uVar55 >> 7) & 1);
                        auVar108._28_4_ =
                             (uint)bVar10 * auVar107._28_4_ |
                             (uint)!bVar10 * *(int *)(local_910.ray + 0x21c);
                        bVar10 = (bool)((byte)(uVar55 >> 8) & 1);
                        auVar108._32_4_ =
                             (uint)bVar10 * auVar107._32_4_ |
                             (uint)!bVar10 * *(int *)(local_910.ray + 0x220);
                        bVar10 = (bool)((byte)(uVar55 >> 9) & 1);
                        auVar108._36_4_ =
                             (uint)bVar10 * auVar107._36_4_ |
                             (uint)!bVar10 * *(int *)(local_910.ray + 0x224);
                        bVar10 = (bool)((byte)(uVar55 >> 10) & 1);
                        auVar108._40_4_ =
                             (uint)bVar10 * auVar107._40_4_ |
                             (uint)!bVar10 * *(int *)(local_910.ray + 0x228);
                        bVar10 = (bool)((byte)(uVar55 >> 0xb) & 1);
                        auVar108._44_4_ =
                             (uint)bVar10 * auVar107._44_4_ |
                             (uint)!bVar10 * *(int *)(local_910.ray + 0x22c);
                        bVar10 = (bool)((byte)(uVar55 >> 0xc) & 1);
                        auVar108._48_4_ =
                             (uint)bVar10 * auVar107._48_4_ |
                             (uint)!bVar10 * *(int *)(local_910.ray + 0x230);
                        bVar10 = (bool)((byte)(uVar55 >> 0xd) & 1);
                        auVar108._52_4_ =
                             (uint)bVar10 * auVar107._52_4_ |
                             (uint)!bVar10 * *(int *)(local_910.ray + 0x234);
                        bVar10 = (bool)((byte)(uVar55 >> 0xe) & 1);
                        auVar108._56_4_ =
                             (uint)bVar10 * auVar107._56_4_ |
                             (uint)!bVar10 * *(int *)(local_910.ray + 0x238);
                        bVar10 = SUB81(uVar55 >> 0xf,0);
                        auVar108._60_4_ =
                             (uint)bVar10 * auVar107._60_4_ |
                             (uint)!bVar10 * *(int *)(local_910.ray + 0x23c);
                        *(undefined1 (*) [64])(local_910.ray + 0x200) = auVar108;
                        if ((short)uVar55 != 0) {
                          uVar58 = CONCAT71((int7)(uVar58 >> 8),1);
                          break;
                        }
                      }
                      *(int *)(ray + k * 4 + 0x200) = auVar171._0_4_;
                      uVar58 = 0;
                      lVar59 = 0;
                      local_720 = local_720 ^ 1L << ((ulong)local_6c0 & 0x3f);
                      for (uVar55 = local_720; (uVar55 & 1) == 0;
                          uVar55 = uVar55 >> 1 | 0x8000000000000000) {
                        lVar59 = lVar59 + 1;
                      }
                    } while (local_720 != 0);
                  }
                  goto LAB_01aa5d72;
                }
              }
            }
          }
          uVar58 = 0;
        }
      }
LAB_01aa5d72:
      if (8 < iVar7) {
        local_7c0 = vpbroadcastd_avx512vl();
        uStack_69c = local_6a0;
        uStack_698 = local_6a0;
        uStack_694 = local_6a0;
        uStack_690 = local_6a0;
        uStack_68c = local_6a0;
        uStack_688 = local_6a0;
        uStack_684 = local_6a0;
        fStack_718 = 1.0 / (float)local_440._0_4_;
        auVar171 = vpbroadcastd_avx512f();
        local_440 = vmovdqa64_avx512f(auVar171);
        auVar171 = vpbroadcastd_avx512f();
        local_400 = vmovdqa64_avx512f(auVar171);
        lVar59 = 8;
        fStack_714 = fStack_718;
        fStack_710 = fStack_718;
        fStack_70c = fStack_718;
        fStack_708 = fStack_718;
        fStack_704 = fStack_718;
        local_6c0 = uVar60;
        uStack_6bc = uVar60;
        uStack_6b8 = uVar60;
        uStack_6b4 = uVar60;
        uStack_6b0 = uVar60;
        uStack_6ac = uVar60;
        uStack_6a8 = uVar60;
        uStack_6a4 = uVar60;
        local_720._0_4_ = fStack_718;
        local_720._4_4_ = fStack_718;
        do {
          auVar84 = vpbroadcastd_avx512vl();
          auVar71 = vpor_avx2(auVar84,_DAT_01fe9900);
          uVar24 = vpcmpd_avx512vl(auVar71,local_7c0,1);
          auVar84 = *(undefined1 (*) [32])(bezier_basis0 + lVar59 * 4 + lVar51);
          auVar85 = *(undefined1 (*) [32])(lVar51 + 0x21aa768 + lVar59 * 4);
          auVar83 = *(undefined1 (*) [32])(lVar51 + 0x21aabec + lVar59 * 4);
          auVar82 = *(undefined1 (*) [32])(lVar51 + 0x21ab070 + lVar59 * 4);
          local_860 = auVar183._0_32_;
          auVar72 = vmulps_avx512vl(local_860,auVar82);
          local_880 = auVar184._0_32_;
          auVar81 = vmulps_avx512vl(local_880,auVar82);
          auVar33._4_4_ = auVar82._4_4_ * (float)local_360._4_4_;
          auVar33._0_4_ = auVar82._0_4_ * (float)local_360._0_4_;
          auVar33._8_4_ = auVar82._8_4_ * fStack_358;
          auVar33._12_4_ = auVar82._12_4_ * fStack_354;
          auVar33._16_4_ = auVar82._16_4_ * fStack_350;
          auVar33._20_4_ = auVar82._20_4_ * fStack_34c;
          auVar33._24_4_ = auVar82._24_4_ * fStack_348;
          auVar33._28_4_ = auVar71._28_4_;
          local_820 = auVar182._0_32_;
          auVar71 = vfmadd231ps_avx512vl(auVar72,auVar83,local_820);
          local_840 = auVar181._0_32_;
          auVar72 = vfmadd231ps_avx512vl(auVar81,auVar83,local_840);
          auVar68 = vfmadd231ps_fma(auVar33,auVar83,local_340);
          auVar87 = auVar122._0_32_;
          auVar71 = vfmadd231ps_avx512vl(auVar71,auVar85,auVar87);
          local_800 = auVar180._0_32_;
          auVar72 = vfmadd231ps_avx512vl(auVar72,auVar85,local_800);
          auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar85,local_320);
          auVar88 = auVar178._0_32_;
          auVar76 = vfmadd231ps_avx512vl(auVar71,auVar84,auVar88);
          auVar89 = auVar179._0_32_;
          auVar77 = vfmadd231ps_avx512vl(auVar72,auVar84,auVar89);
          auVar71 = *(undefined1 (*) [32])(bezier_basis1 + lVar59 * 4 + lVar51);
          auVar72 = *(undefined1 (*) [32])(lVar51 + 0x21acb88 + lVar59 * 4);
          auVar78 = vfmadd231ps_avx512vl(ZEXT1632(auVar68),auVar84,local_380);
          auVar81 = *(undefined1 (*) [32])(lVar51 + 0x21ad00c + lVar59 * 4);
          auVar73 = *(undefined1 (*) [32])(lVar51 + 0x21ad490 + lVar59 * 4);
          auVar74 = vmulps_avx512vl(local_860,auVar73);
          auVar75 = vmulps_avx512vl(local_880,auVar73);
          auVar34._4_4_ = auVar73._4_4_ * (float)local_360._4_4_;
          auVar34._0_4_ = auVar73._0_4_ * (float)local_360._0_4_;
          auVar34._8_4_ = auVar73._8_4_ * fStack_358;
          auVar34._12_4_ = auVar73._12_4_ * fStack_354;
          auVar34._16_4_ = auVar73._16_4_ * fStack_350;
          auVar34._20_4_ = auVar73._20_4_ * fStack_34c;
          auVar34._24_4_ = auVar73._24_4_ * fStack_348;
          auVar34._28_4_ = uStack_344;
          auVar74 = vfmadd231ps_avx512vl(auVar74,auVar81,local_820);
          auVar75 = vfmadd231ps_avx512vl(auVar75,auVar81,local_840);
          auVar68 = vfmadd231ps_fma(auVar34,auVar81,local_340);
          auVar74 = vfmadd231ps_avx512vl(auVar74,auVar72,auVar87);
          auVar75 = vfmadd231ps_avx512vl(auVar75,auVar72,local_800);
          auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar72,local_320);
          auVar79 = vfmadd231ps_avx512vl(auVar74,auVar71,auVar88);
          auVar80 = vfmadd231ps_avx512vl(auVar75,auVar71,auVar89);
          auVar86 = vfmadd231ps_avx512vl(ZEXT1632(auVar68),auVar71,local_380);
          auVar94 = vmaxps_avx512vl(auVar78,auVar86);
          auVar74 = vsubps_avx(auVar79,auVar76);
          auVar75 = vsubps_avx(auVar80,auVar77);
          auVar95 = vmulps_avx512vl(auVar77,auVar74);
          auVar96 = vmulps_avx512vl(auVar76,auVar75);
          auVar95 = vsubps_avx512vl(auVar95,auVar96);
          auVar96 = vmulps_avx512vl(auVar75,auVar75);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar74,auVar74);
          auVar94 = vmulps_avx512vl(auVar94,auVar94);
          auVar94 = vmulps_avx512vl(auVar94,auVar96);
          auVar95 = vmulps_avx512vl(auVar95,auVar95);
          uVar23 = vcmpps_avx512vl(auVar95,auVar94,2);
          bVar62 = (byte)uVar24 & (byte)uVar23;
          if (bVar62 == 0) {
            auVar122 = ZEXT3264(auVar87);
          }
          else {
            auVar73 = vmulps_avx512vl(local_3c0,auVar73);
            auVar81 = vfmadd213ps_avx512vl(auVar81,local_3a0,auVar73);
            auVar72 = vfmadd213ps_avx512vl(auVar72,local_480,auVar81);
            auVar71 = vfmadd213ps_avx512vl(auVar71,local_460,auVar72);
            auVar82 = vmulps_avx512vl(local_3c0,auVar82);
            auVar83 = vfmadd213ps_avx512vl(auVar83,local_3a0,auVar82);
            auVar85 = vfmadd213ps_avx512vl(auVar85,local_480,auVar83);
            auVar72 = vfmadd213ps_avx512vl(auVar84,local_460,auVar85);
            auVar84 = *(undefined1 (*) [32])(lVar51 + 0x21ab4f4 + lVar59 * 4);
            auVar85 = *(undefined1 (*) [32])(lVar51 + 0x21ab978 + lVar59 * 4);
            auVar83 = *(undefined1 (*) [32])(lVar51 + 0x21abdfc + lVar59 * 4);
            auVar82 = *(undefined1 (*) [32])(lVar51 + 0x21ac280 + lVar59 * 4);
            auVar81 = vmulps_avx512vl(local_860,auVar82);
            auVar73 = vmulps_avx512vl(local_880,auVar82);
            auVar82 = vmulps_avx512vl(local_3c0,auVar82);
            auVar81 = vfmadd231ps_avx512vl(auVar81,auVar83,local_820);
            auVar73 = vfmadd231ps_avx512vl(auVar73,auVar83,local_840);
            auVar83 = vfmadd231ps_avx512vl(auVar82,local_3a0,auVar83);
            auVar82 = vfmadd231ps_avx512vl(auVar81,auVar85,auVar87);
            auVar81 = vfmadd231ps_avx512vl(auVar73,auVar85,local_800);
            auVar85 = vfmadd231ps_avx512vl(auVar83,local_480,auVar85);
            auVar82 = vfmadd231ps_avx512vl(auVar82,auVar84,auVar88);
            auVar81 = vfmadd231ps_avx512vl(auVar81,auVar84,auVar89);
            auVar73 = vfmadd231ps_avx512vl(auVar85,local_460,auVar84);
            auVar84 = *(undefined1 (*) [32])(lVar51 + 0x21ad914 + lVar59 * 4);
            auVar85 = *(undefined1 (*) [32])(lVar51 + 0x21ae21c + lVar59 * 4);
            auVar83 = *(undefined1 (*) [32])(lVar51 + 0x21ae6a0 + lVar59 * 4);
            auVar94 = vmulps_avx512vl(local_860,auVar83);
            auVar95 = vmulps_avx512vl(local_880,auVar83);
            auVar83 = vmulps_avx512vl(local_3c0,auVar83);
            auVar94 = vfmadd231ps_avx512vl(auVar94,auVar85,local_820);
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar85,local_840);
            auVar83 = vfmadd231ps_avx512vl(auVar83,local_3a0,auVar85);
            auVar85 = *(undefined1 (*) [32])(lVar51 + 0x21add98 + lVar59 * 4);
            auVar94 = vfmadd231ps_avx512vl(auVar94,auVar85,auVar87);
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar85,local_800);
            auVar85 = vfmadd231ps_avx512vl(auVar83,local_480,auVar85);
            auVar83 = vfmadd231ps_avx512vl(auVar94,auVar84,auVar88);
            auVar94 = vfmadd231ps_avx512vl(auVar95,auVar84,auVar89);
            auVar85 = vfmadd231ps_avx512vl(auVar85,local_460,auVar84);
            auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar82,auVar95);
            vandps_avx512vl(auVar81,auVar95);
            auVar84 = vmaxps_avx(auVar95,auVar95);
            vandps_avx512vl(auVar73,auVar95);
            auVar84 = vmaxps_avx(auVar84,auVar95);
            auVar53._4_4_ = uStack_69c;
            auVar53._0_4_ = local_6a0;
            auVar53._8_4_ = uStack_698;
            auVar53._12_4_ = uStack_694;
            auVar53._16_4_ = uStack_690;
            auVar53._20_4_ = uStack_68c;
            auVar53._24_4_ = uStack_688;
            auVar53._28_4_ = uStack_684;
            uVar55 = vcmpps_avx512vl(auVar84,auVar53,1);
            bVar10 = (bool)((byte)uVar55 & 1);
            auVar97._0_4_ = (float)((uint)bVar10 * auVar74._0_4_ | (uint)!bVar10 * auVar82._0_4_);
            bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
            auVar97._4_4_ = (float)((uint)bVar10 * auVar74._4_4_ | (uint)!bVar10 * auVar82._4_4_);
            bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
            auVar97._8_4_ = (float)((uint)bVar10 * auVar74._8_4_ | (uint)!bVar10 * auVar82._8_4_);
            bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
            auVar97._12_4_ = (float)((uint)bVar10 * auVar74._12_4_ | (uint)!bVar10 * auVar82._12_4_)
            ;
            bVar10 = (bool)((byte)(uVar55 >> 4) & 1);
            auVar97._16_4_ = (float)((uint)bVar10 * auVar74._16_4_ | (uint)!bVar10 * auVar82._16_4_)
            ;
            bVar10 = (bool)((byte)(uVar55 >> 5) & 1);
            auVar97._20_4_ = (float)((uint)bVar10 * auVar74._20_4_ | (uint)!bVar10 * auVar82._20_4_)
            ;
            bVar10 = (bool)((byte)(uVar55 >> 6) & 1);
            auVar97._24_4_ = (float)((uint)bVar10 * auVar74._24_4_ | (uint)!bVar10 * auVar82._24_4_)
            ;
            bVar10 = SUB81(uVar55 >> 7,0);
            auVar97._28_4_ = (uint)bVar10 * auVar74._28_4_ | (uint)!bVar10 * auVar82._28_4_;
            bVar10 = (bool)((byte)uVar55 & 1);
            auVar98._0_4_ = (float)((uint)bVar10 * auVar75._0_4_ | (uint)!bVar10 * auVar81._0_4_);
            bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
            auVar98._4_4_ = (float)((uint)bVar10 * auVar75._4_4_ | (uint)!bVar10 * auVar81._4_4_);
            bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
            auVar98._8_4_ = (float)((uint)bVar10 * auVar75._8_4_ | (uint)!bVar10 * auVar81._8_4_);
            bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
            auVar98._12_4_ = (float)((uint)bVar10 * auVar75._12_4_ | (uint)!bVar10 * auVar81._12_4_)
            ;
            bVar10 = (bool)((byte)(uVar55 >> 4) & 1);
            auVar98._16_4_ = (float)((uint)bVar10 * auVar75._16_4_ | (uint)!bVar10 * auVar81._16_4_)
            ;
            bVar10 = (bool)((byte)(uVar55 >> 5) & 1);
            auVar98._20_4_ = (float)((uint)bVar10 * auVar75._20_4_ | (uint)!bVar10 * auVar81._20_4_)
            ;
            bVar10 = (bool)((byte)(uVar55 >> 6) & 1);
            auVar98._24_4_ = (float)((uint)bVar10 * auVar75._24_4_ | (uint)!bVar10 * auVar81._24_4_)
            ;
            bVar10 = SUB81(uVar55 >> 7,0);
            auVar98._28_4_ = (uint)bVar10 * auVar75._28_4_ | (uint)!bVar10 * auVar81._28_4_;
            vandps_avx512vl(auVar83,auVar95);
            vandps_avx512vl(auVar94,auVar95);
            auVar84 = vmaxps_avx(auVar98,auVar98);
            vandps_avx512vl(auVar85,auVar95);
            auVar84 = vmaxps_avx(auVar84,auVar98);
            uVar55 = vcmpps_avx512vl(auVar84,auVar53,1);
            bVar10 = (bool)((byte)uVar55 & 1);
            auVar99._0_4_ = (uint)bVar10 * auVar74._0_4_ | (uint)!bVar10 * auVar83._0_4_;
            bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
            auVar99._4_4_ = (uint)bVar10 * auVar74._4_4_ | (uint)!bVar10 * auVar83._4_4_;
            bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
            auVar99._8_4_ = (uint)bVar10 * auVar74._8_4_ | (uint)!bVar10 * auVar83._8_4_;
            bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
            auVar99._12_4_ = (uint)bVar10 * auVar74._12_4_ | (uint)!bVar10 * auVar83._12_4_;
            bVar10 = (bool)((byte)(uVar55 >> 4) & 1);
            auVar99._16_4_ = (uint)bVar10 * auVar74._16_4_ | (uint)!bVar10 * auVar83._16_4_;
            bVar10 = (bool)((byte)(uVar55 >> 5) & 1);
            auVar99._20_4_ = (uint)bVar10 * auVar74._20_4_ | (uint)!bVar10 * auVar83._20_4_;
            bVar10 = (bool)((byte)(uVar55 >> 6) & 1);
            auVar99._24_4_ = (uint)bVar10 * auVar74._24_4_ | (uint)!bVar10 * auVar83._24_4_;
            bVar10 = SUB81(uVar55 >> 7,0);
            auVar99._28_4_ = (uint)bVar10 * auVar74._28_4_ | (uint)!bVar10 * auVar83._28_4_;
            bVar10 = (bool)((byte)uVar55 & 1);
            auVar100._0_4_ = (float)((uint)bVar10 * auVar75._0_4_ | (uint)!bVar10 * auVar94._0_4_);
            bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
            auVar100._4_4_ = (float)((uint)bVar10 * auVar75._4_4_ | (uint)!bVar10 * auVar94._4_4_);
            bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
            auVar100._8_4_ = (float)((uint)bVar10 * auVar75._8_4_ | (uint)!bVar10 * auVar94._8_4_);
            bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
            auVar100._12_4_ =
                 (float)((uint)bVar10 * auVar75._12_4_ | (uint)!bVar10 * auVar94._12_4_);
            bVar10 = (bool)((byte)(uVar55 >> 4) & 1);
            auVar100._16_4_ =
                 (float)((uint)bVar10 * auVar75._16_4_ | (uint)!bVar10 * auVar94._16_4_);
            bVar10 = (bool)((byte)(uVar55 >> 5) & 1);
            auVar100._20_4_ =
                 (float)((uint)bVar10 * auVar75._20_4_ | (uint)!bVar10 * auVar94._20_4_);
            bVar10 = (bool)((byte)(uVar55 >> 6) & 1);
            auVar100._24_4_ =
                 (float)((uint)bVar10 * auVar75._24_4_ | (uint)!bVar10 * auVar94._24_4_);
            bVar10 = SUB81(uVar55 >> 7,0);
            auVar100._28_4_ = (uint)bVar10 * auVar75._28_4_ | (uint)!bVar10 * auVar94._28_4_;
            auVar163._8_4_ = 0x80000000;
            auVar163._0_8_ = 0x8000000080000000;
            auVar163._12_4_ = 0x80000000;
            auVar163._16_4_ = 0x80000000;
            auVar163._20_4_ = 0x80000000;
            auVar163._24_4_ = 0x80000000;
            auVar163._28_4_ = 0x80000000;
            auVar84 = vxorps_avx512vl(auVar99,auVar163);
            auVar94 = auVar177._0_32_;
            auVar85 = vfmadd213ps_avx512vl(auVar97,auVar97,auVar94);
            auVar68 = vfmadd231ps_fma(auVar85,auVar98,auVar98);
            auVar85 = vrsqrt14ps_avx512vl(ZEXT1632(auVar68));
            auVar174._8_4_ = 0xbf000000;
            auVar174._0_8_ = 0xbf000000bf000000;
            auVar174._12_4_ = 0xbf000000;
            auVar174._16_4_ = 0xbf000000;
            auVar174._20_4_ = 0xbf000000;
            auVar174._24_4_ = 0xbf000000;
            auVar174._28_4_ = 0xbf000000;
            fVar137 = auVar85._0_4_;
            fVar123 = auVar85._4_4_;
            fVar124 = auVar85._8_4_;
            fVar125 = auVar85._12_4_;
            fVar153 = auVar85._16_4_;
            fVar157 = auVar85._20_4_;
            fVar158 = auVar85._24_4_;
            auVar35._4_4_ = fVar123 * fVar123 * fVar123 * auVar68._4_4_ * -0.5;
            auVar35._0_4_ = fVar137 * fVar137 * fVar137 * auVar68._0_4_ * -0.5;
            auVar35._8_4_ = fVar124 * fVar124 * fVar124 * auVar68._8_4_ * -0.5;
            auVar35._12_4_ = fVar125 * fVar125 * fVar125 * auVar68._12_4_ * -0.5;
            auVar35._16_4_ = fVar153 * fVar153 * fVar153 * -0.0;
            auVar35._20_4_ = fVar157 * fVar157 * fVar157 * -0.0;
            auVar35._24_4_ = fVar158 * fVar158 * fVar158 * -0.0;
            auVar35._28_4_ = auVar98._28_4_;
            auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar85 = vfmadd231ps_avx512vl(auVar35,auVar83,auVar85);
            auVar36._4_4_ = auVar98._4_4_ * auVar85._4_4_;
            auVar36._0_4_ = auVar98._0_4_ * auVar85._0_4_;
            auVar36._8_4_ = auVar98._8_4_ * auVar85._8_4_;
            auVar36._12_4_ = auVar98._12_4_ * auVar85._12_4_;
            auVar36._16_4_ = auVar98._16_4_ * auVar85._16_4_;
            auVar36._20_4_ = auVar98._20_4_ * auVar85._20_4_;
            auVar36._24_4_ = auVar98._24_4_ * auVar85._24_4_;
            auVar36._28_4_ = 0;
            auVar37._4_4_ = auVar85._4_4_ * -auVar97._4_4_;
            auVar37._0_4_ = auVar85._0_4_ * -auVar97._0_4_;
            auVar37._8_4_ = auVar85._8_4_ * -auVar97._8_4_;
            auVar37._12_4_ = auVar85._12_4_ * -auVar97._12_4_;
            auVar37._16_4_ = auVar85._16_4_ * -auVar97._16_4_;
            auVar37._20_4_ = auVar85._20_4_ * -auVar97._20_4_;
            auVar37._24_4_ = auVar85._24_4_ * -auVar97._24_4_;
            auVar37._28_4_ = auVar98._28_4_;
            auVar82 = vmulps_avx512vl(auVar85,auVar94);
            auVar85 = vfmadd213ps_avx512vl(auVar99,auVar99,auVar94);
            auVar85 = vfmadd231ps_avx512vl(auVar85,auVar100,auVar100);
            auVar81 = vrsqrt14ps_avx512vl(auVar85);
            auVar85 = vmulps_avx512vl(auVar85,auVar174);
            fVar137 = auVar81._0_4_;
            fVar123 = auVar81._4_4_;
            fVar124 = auVar81._8_4_;
            fVar125 = auVar81._12_4_;
            fVar153 = auVar81._16_4_;
            fVar157 = auVar81._20_4_;
            fVar158 = auVar81._24_4_;
            auVar38._4_4_ = fVar123 * fVar123 * fVar123 * auVar85._4_4_;
            auVar38._0_4_ = fVar137 * fVar137 * fVar137 * auVar85._0_4_;
            auVar38._8_4_ = fVar124 * fVar124 * fVar124 * auVar85._8_4_;
            auVar38._12_4_ = fVar125 * fVar125 * fVar125 * auVar85._12_4_;
            auVar38._16_4_ = fVar153 * fVar153 * fVar153 * auVar85._16_4_;
            auVar38._20_4_ = fVar157 * fVar157 * fVar157 * auVar85._20_4_;
            auVar38._24_4_ = fVar158 * fVar158 * fVar158 * auVar85._24_4_;
            auVar38._28_4_ = auVar85._28_4_;
            auVar85 = vfmadd231ps_avx512vl(auVar38,auVar83,auVar81);
            auVar39._4_4_ = auVar100._4_4_ * auVar85._4_4_;
            auVar39._0_4_ = auVar100._0_4_ * auVar85._0_4_;
            auVar39._8_4_ = auVar100._8_4_ * auVar85._8_4_;
            auVar39._12_4_ = auVar100._12_4_ * auVar85._12_4_;
            auVar39._16_4_ = auVar100._16_4_ * auVar85._16_4_;
            auVar39._20_4_ = auVar100._20_4_ * auVar85._20_4_;
            auVar39._24_4_ = auVar100._24_4_ * auVar85._24_4_;
            auVar39._28_4_ = auVar81._28_4_;
            auVar40._4_4_ = auVar85._4_4_ * auVar84._4_4_;
            auVar40._0_4_ = auVar85._0_4_ * auVar84._0_4_;
            auVar40._8_4_ = auVar85._8_4_ * auVar84._8_4_;
            auVar40._12_4_ = auVar85._12_4_ * auVar84._12_4_;
            auVar40._16_4_ = auVar85._16_4_ * auVar84._16_4_;
            auVar40._20_4_ = auVar85._20_4_ * auVar84._20_4_;
            auVar40._24_4_ = auVar85._24_4_ * auVar84._24_4_;
            auVar40._28_4_ = auVar84._28_4_;
            auVar84 = vmulps_avx512vl(auVar85,auVar94);
            auVar68 = vfmadd213ps_fma(auVar36,auVar78,auVar76);
            auVar66 = vfmadd213ps_fma(auVar37,auVar78,auVar77);
            auVar83 = vfmadd213ps_avx512vl(auVar82,auVar78,auVar72);
            auVar81 = vfmadd213ps_avx512vl(auVar39,auVar86,auVar79);
            auVar20 = vfnmadd213ps_fma(auVar36,auVar78,auVar76);
            auVar176 = vfmadd213ps_fma(auVar40,auVar86,auVar80);
            auVar21 = vfnmadd213ps_fma(auVar37,auVar78,auVar77);
            auVar16 = vfmadd213ps_fma(auVar84,auVar86,auVar71);
            auVar69 = vfnmadd231ps_fma(auVar72,auVar78,auVar82);
            auVar22 = vfnmadd213ps_fma(auVar39,auVar86,auVar79);
            auVar67 = vfnmadd213ps_fma(auVar40,auVar86,auVar80);
            auVar65 = vfnmadd231ps_fma(auVar71,auVar86,auVar84);
            auVar71 = vsubps_avx512vl(auVar81,ZEXT1632(auVar20));
            auVar84 = vsubps_avx(ZEXT1632(auVar176),ZEXT1632(auVar21));
            auVar85 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar69));
            auVar41._4_4_ = auVar84._4_4_ * auVar69._4_4_;
            auVar41._0_4_ = auVar84._0_4_ * auVar69._0_4_;
            auVar41._8_4_ = auVar84._8_4_ * auVar69._8_4_;
            auVar41._12_4_ = auVar84._12_4_ * auVar69._12_4_;
            auVar41._16_4_ = auVar84._16_4_ * 0.0;
            auVar41._20_4_ = auVar84._20_4_ * 0.0;
            auVar41._24_4_ = auVar84._24_4_ * 0.0;
            auVar41._28_4_ = auVar82._28_4_;
            auVar17 = vfmsub231ps_fma(auVar41,ZEXT1632(auVar21),auVar85);
            auVar42._4_4_ = auVar85._4_4_ * auVar20._4_4_;
            auVar42._0_4_ = auVar85._0_4_ * auVar20._0_4_;
            auVar42._8_4_ = auVar85._8_4_ * auVar20._8_4_;
            auVar42._12_4_ = auVar85._12_4_ * auVar20._12_4_;
            auVar42._16_4_ = auVar85._16_4_ * 0.0;
            auVar42._20_4_ = auVar85._20_4_ * 0.0;
            auVar42._24_4_ = auVar85._24_4_ * 0.0;
            auVar42._28_4_ = auVar85._28_4_;
            auVar18 = vfmsub231ps_fma(auVar42,ZEXT1632(auVar69),auVar71);
            auVar43._4_4_ = auVar21._4_4_ * auVar71._4_4_;
            auVar43._0_4_ = auVar21._0_4_ * auVar71._0_4_;
            auVar43._8_4_ = auVar21._8_4_ * auVar71._8_4_;
            auVar43._12_4_ = auVar21._12_4_ * auVar71._12_4_;
            auVar43._16_4_ = auVar71._16_4_ * 0.0;
            auVar43._20_4_ = auVar71._20_4_ * 0.0;
            auVar43._24_4_ = auVar71._24_4_ * 0.0;
            auVar43._28_4_ = auVar71._28_4_;
            auVar19 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar20),auVar84);
            auVar84 = vfmadd231ps_avx512vl(ZEXT1632(auVar19),auVar94,ZEXT1632(auVar18));
            auVar84 = vfmadd231ps_avx512vl(auVar84,auVar94,ZEXT1632(auVar17));
            uVar55 = vcmpps_avx512vl(auVar84,auVar94,2);
            bVar54 = (byte)uVar55;
            fVar63 = (float)((uint)(bVar54 & 1) * auVar68._0_4_ |
                            (uint)!(bool)(bVar54 & 1) * auVar22._0_4_);
            bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
            fVar109 = (float)((uint)bVar10 * auVar68._4_4_ | (uint)!bVar10 * auVar22._4_4_);
            bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
            fVar111 = (float)((uint)bVar10 * auVar68._8_4_ | (uint)!bVar10 * auVar22._8_4_);
            bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
            fVar113 = (float)((uint)bVar10 * auVar68._12_4_ | (uint)!bVar10 * auVar22._12_4_);
            auVar73 = ZEXT1632(CONCAT412(fVar113,CONCAT48(fVar111,CONCAT44(fVar109,fVar63))));
            fVar64 = (float)((uint)(bVar54 & 1) * auVar66._0_4_ |
                            (uint)!(bool)(bVar54 & 1) * auVar67._0_4_);
            bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
            fVar110 = (float)((uint)bVar10 * auVar66._4_4_ | (uint)!bVar10 * auVar67._4_4_);
            bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
            fVar112 = (float)((uint)bVar10 * auVar66._8_4_ | (uint)!bVar10 * auVar67._8_4_);
            bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
            fVar114 = (float)((uint)bVar10 * auVar66._12_4_ | (uint)!bVar10 * auVar67._12_4_);
            auVar74 = ZEXT1632(CONCAT412(fVar114,CONCAT48(fVar112,CONCAT44(fVar110,fVar64))));
            auVar101._0_4_ =
                 (float)((uint)(bVar54 & 1) * auVar83._0_4_ |
                        (uint)!(bool)(bVar54 & 1) * auVar65._0_4_);
            bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
            auVar101._4_4_ = (float)((uint)bVar10 * auVar83._4_4_ | (uint)!bVar10 * auVar65._4_4_);
            bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
            auVar101._8_4_ = (float)((uint)bVar10 * auVar83._8_4_ | (uint)!bVar10 * auVar65._8_4_);
            bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
            auVar101._12_4_ =
                 (float)((uint)bVar10 * auVar83._12_4_ | (uint)!bVar10 * auVar65._12_4_);
            fVar137 = (float)((uint)((byte)(uVar55 >> 4) & 1) * auVar83._16_4_);
            auVar101._16_4_ = fVar137;
            fVar123 = (float)((uint)((byte)(uVar55 >> 5) & 1) * auVar83._20_4_);
            auVar101._20_4_ = fVar123;
            fVar124 = (float)((uint)((byte)(uVar55 >> 6) & 1) * auVar83._24_4_);
            auVar101._24_4_ = fVar124;
            iVar1 = (uint)(byte)(uVar55 >> 7) * auVar83._28_4_;
            auVar101._28_4_ = iVar1;
            auVar84 = vblendmps_avx512vl(ZEXT1632(auVar20),auVar81);
            auVar102._0_4_ =
                 (uint)(bVar54 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar17._0_4_;
            bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
            auVar102._4_4_ = (uint)bVar10 * auVar84._4_4_ | (uint)!bVar10 * auVar17._4_4_;
            bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
            auVar102._8_4_ = (uint)bVar10 * auVar84._8_4_ | (uint)!bVar10 * auVar17._8_4_;
            bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
            auVar102._12_4_ = (uint)bVar10 * auVar84._12_4_ | (uint)!bVar10 * auVar17._12_4_;
            auVar102._16_4_ = (uint)((byte)(uVar55 >> 4) & 1) * auVar84._16_4_;
            auVar102._20_4_ = (uint)((byte)(uVar55 >> 5) & 1) * auVar84._20_4_;
            auVar102._24_4_ = (uint)((byte)(uVar55 >> 6) & 1) * auVar84._24_4_;
            auVar102._28_4_ = (uint)(byte)(uVar55 >> 7) * auVar84._28_4_;
            auVar84 = vblendmps_avx512vl(ZEXT1632(auVar21),ZEXT1632(auVar176));
            auVar103._0_4_ =
                 (float)((uint)(bVar54 & 1) * auVar84._0_4_ |
                        (uint)!(bool)(bVar54 & 1) * auVar68._0_4_);
            bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
            auVar103._4_4_ = (float)((uint)bVar10 * auVar84._4_4_ | (uint)!bVar10 * auVar68._4_4_);
            bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
            auVar103._8_4_ = (float)((uint)bVar10 * auVar84._8_4_ | (uint)!bVar10 * auVar68._8_4_);
            bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
            auVar103._12_4_ =
                 (float)((uint)bVar10 * auVar84._12_4_ | (uint)!bVar10 * auVar68._12_4_);
            fVar125 = (float)((uint)((byte)(uVar55 >> 4) & 1) * auVar84._16_4_);
            auVar103._16_4_ = fVar125;
            fVar157 = (float)((uint)((byte)(uVar55 >> 5) & 1) * auVar84._20_4_);
            auVar103._20_4_ = fVar157;
            fVar153 = (float)((uint)((byte)(uVar55 >> 6) & 1) * auVar84._24_4_);
            auVar103._24_4_ = fVar153;
            auVar103._28_4_ = (uint)(byte)(uVar55 >> 7) * auVar84._28_4_;
            auVar84 = vblendmps_avx512vl(ZEXT1632(auVar69),ZEXT1632(auVar16));
            auVar104._0_4_ =
                 (float)((uint)(bVar54 & 1) * auVar84._0_4_ |
                        (uint)!(bool)(bVar54 & 1) * auVar66._0_4_);
            bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
            auVar104._4_4_ = (float)((uint)bVar10 * auVar84._4_4_ | (uint)!bVar10 * auVar66._4_4_);
            bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
            auVar104._8_4_ = (float)((uint)bVar10 * auVar84._8_4_ | (uint)!bVar10 * auVar66._8_4_);
            bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
            auVar104._12_4_ =
                 (float)((uint)bVar10 * auVar84._12_4_ | (uint)!bVar10 * auVar66._12_4_);
            fVar160 = (float)((uint)((byte)(uVar55 >> 4) & 1) * auVar84._16_4_);
            auVar104._16_4_ = fVar160;
            fVar158 = (float)((uint)((byte)(uVar55 >> 5) & 1) * auVar84._20_4_);
            auVar104._20_4_ = fVar158;
            fVar159 = (float)((uint)((byte)(uVar55 >> 6) & 1) * auVar84._24_4_);
            auVar104._24_4_ = fVar159;
            iVar2 = (uint)(byte)(uVar55 >> 7) * auVar84._28_4_;
            auVar104._28_4_ = iVar2;
            auVar105._0_4_ =
                 (uint)(bVar54 & 1) * (int)auVar20._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar81._0_4_
            ;
            bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
            auVar105._4_4_ = (uint)bVar10 * (int)auVar20._4_4_ | (uint)!bVar10 * auVar81._4_4_;
            bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
            auVar105._8_4_ = (uint)bVar10 * (int)auVar20._8_4_ | (uint)!bVar10 * auVar81._8_4_;
            bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
            auVar105._12_4_ = (uint)bVar10 * (int)auVar20._12_4_ | (uint)!bVar10 * auVar81._12_4_;
            auVar105._16_4_ = (uint)!(bool)((byte)(uVar55 >> 4) & 1) * auVar81._16_4_;
            auVar105._20_4_ = (uint)!(bool)((byte)(uVar55 >> 5) & 1) * auVar81._20_4_;
            auVar105._24_4_ = (uint)!(bool)((byte)(uVar55 >> 6) & 1) * auVar81._24_4_;
            auVar105._28_4_ = (uint)!SUB81(uVar55 >> 7,0) * auVar81._28_4_;
            bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
            bVar12 = (bool)((byte)(uVar55 >> 2) & 1);
            bVar14 = (bool)((byte)(uVar55 >> 3) & 1);
            bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
            bVar13 = (bool)((byte)(uVar55 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar55 >> 3) & 1);
            auVar81 = vsubps_avx512vl(auVar105,auVar73);
            auVar85 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar21._12_4_ |
                                                    (uint)!bVar14 * auVar176._12_4_,
                                                    CONCAT48((uint)bVar12 * (int)auVar21._8_4_ |
                                                             (uint)!bVar12 * auVar176._8_4_,
                                                             CONCAT44((uint)bVar10 *
                                                                      (int)auVar21._4_4_ |
                                                                      (uint)!bVar10 * auVar176._4_4_
                                                                      ,(uint)(bVar54 & 1) *
                                                                       (int)auVar21._0_4_ |
                                                                       (uint)!(bool)(bVar54 & 1) *
                                                                       auVar176._0_4_)))),auVar74);
            auVar83 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar69._12_4_ |
                                                    (uint)!bVar15 * auVar16._12_4_,
                                                    CONCAT48((uint)bVar13 * (int)auVar69._8_4_ |
                                                             (uint)!bVar13 * auVar16._8_4_,
                                                             CONCAT44((uint)bVar11 *
                                                                      (int)auVar69._4_4_ |
                                                                      (uint)!bVar11 * auVar16._4_4_,
                                                                      (uint)(bVar54 & 1) *
                                                                      (int)auVar69._0_4_ |
                                                                      (uint)!(bool)(bVar54 & 1) *
                                                                      auVar16._0_4_)))),auVar101);
            auVar82 = vsubps_avx(auVar73,auVar102);
            auVar71 = vsubps_avx(auVar74,auVar103);
            auVar72 = vsubps_avx(auVar101,auVar104);
            auVar44._4_4_ = auVar83._4_4_ * fVar109;
            auVar44._0_4_ = auVar83._0_4_ * fVar63;
            auVar44._8_4_ = auVar83._8_4_ * fVar111;
            auVar44._12_4_ = auVar83._12_4_ * fVar113;
            auVar44._16_4_ = auVar83._16_4_ * 0.0;
            auVar44._20_4_ = auVar83._20_4_ * 0.0;
            auVar44._24_4_ = auVar83._24_4_ * 0.0;
            auVar44._28_4_ = 0;
            auVar68 = vfmsub231ps_fma(auVar44,auVar101,auVar81);
            auVar143._0_4_ = fVar64 * auVar81._0_4_;
            auVar143._4_4_ = fVar110 * auVar81._4_4_;
            auVar143._8_4_ = fVar112 * auVar81._8_4_;
            auVar143._12_4_ = fVar114 * auVar81._12_4_;
            auVar143._16_4_ = auVar81._16_4_ * 0.0;
            auVar143._20_4_ = auVar81._20_4_ * 0.0;
            auVar143._24_4_ = auVar81._24_4_ * 0.0;
            auVar143._28_4_ = 0;
            auVar66 = vfmsub231ps_fma(auVar143,auVar73,auVar85);
            auVar84 = vfmadd231ps_avx512vl(ZEXT1632(auVar66),auVar94,ZEXT1632(auVar68));
            auVar148._0_4_ = auVar85._0_4_ * auVar101._0_4_;
            auVar148._4_4_ = auVar85._4_4_ * auVar101._4_4_;
            auVar148._8_4_ = auVar85._8_4_ * auVar101._8_4_;
            auVar148._12_4_ = auVar85._12_4_ * auVar101._12_4_;
            auVar148._16_4_ = auVar85._16_4_ * fVar137;
            auVar148._20_4_ = auVar85._20_4_ * fVar123;
            auVar148._24_4_ = auVar85._24_4_ * fVar124;
            auVar148._28_4_ = 0;
            auVar68 = vfmsub231ps_fma(auVar148,auVar74,auVar83);
            auVar75 = vfmadd231ps_avx512vl(auVar84,auVar94,ZEXT1632(auVar68));
            auVar84 = vmulps_avx512vl(auVar72,auVar102);
            auVar84 = vfmsub231ps_avx512vl(auVar84,auVar82,auVar104);
            auVar45._4_4_ = auVar71._4_4_ * auVar104._4_4_;
            auVar45._0_4_ = auVar71._0_4_ * auVar104._0_4_;
            auVar45._8_4_ = auVar71._8_4_ * auVar104._8_4_;
            auVar45._12_4_ = auVar71._12_4_ * auVar104._12_4_;
            auVar45._16_4_ = auVar71._16_4_ * fVar160;
            auVar45._20_4_ = auVar71._20_4_ * fVar158;
            auVar45._24_4_ = auVar71._24_4_ * fVar159;
            auVar45._28_4_ = iVar2;
            auVar68 = vfmsub231ps_fma(auVar45,auVar103,auVar72);
            auVar149._0_4_ = auVar103._0_4_ * auVar82._0_4_;
            auVar149._4_4_ = auVar103._4_4_ * auVar82._4_4_;
            auVar149._8_4_ = auVar103._8_4_ * auVar82._8_4_;
            auVar149._12_4_ = auVar103._12_4_ * auVar82._12_4_;
            auVar149._16_4_ = fVar125 * auVar82._16_4_;
            auVar149._20_4_ = fVar157 * auVar82._20_4_;
            auVar149._24_4_ = fVar153 * auVar82._24_4_;
            auVar149._28_4_ = 0;
            auVar66 = vfmsub231ps_fma(auVar149,auVar71,auVar102);
            auVar84 = vfmadd231ps_avx512vl(ZEXT1632(auVar66),auVar94,auVar84);
            auVar76 = vfmadd231ps_avx512vl(auVar84,auVar94,ZEXT1632(auVar68));
            auVar84 = vmaxps_avx(auVar75,auVar76);
            uVar23 = vcmpps_avx512vl(auVar84,auVar94,2);
            bVar62 = bVar62 & (byte)uVar23;
            if (bVar62 != 0) {
              uVar115 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar170._4_4_ = uVar115;
              auVar170._0_4_ = uVar115;
              auVar170._8_4_ = uVar115;
              auVar170._12_4_ = uVar115;
              auVar170._16_4_ = uVar115;
              auVar170._20_4_ = uVar115;
              auVar170._24_4_ = uVar115;
              auVar170._28_4_ = uVar115;
              auVar171 = ZEXT3264(auVar170);
              auVar46._4_4_ = auVar72._4_4_ * auVar85._4_4_;
              auVar46._0_4_ = auVar72._0_4_ * auVar85._0_4_;
              auVar46._8_4_ = auVar72._8_4_ * auVar85._8_4_;
              auVar46._12_4_ = auVar72._12_4_ * auVar85._12_4_;
              auVar46._16_4_ = auVar72._16_4_ * auVar85._16_4_;
              auVar46._20_4_ = auVar72._20_4_ * auVar85._20_4_;
              auVar46._24_4_ = auVar72._24_4_ * auVar85._24_4_;
              auVar46._28_4_ = auVar84._28_4_;
              auVar176 = vfmsub231ps_fma(auVar46,auVar71,auVar83);
              auVar47._4_4_ = auVar83._4_4_ * auVar82._4_4_;
              auVar47._0_4_ = auVar83._0_4_ * auVar82._0_4_;
              auVar47._8_4_ = auVar83._8_4_ * auVar82._8_4_;
              auVar47._12_4_ = auVar83._12_4_ * auVar82._12_4_;
              auVar47._16_4_ = auVar83._16_4_ * auVar82._16_4_;
              auVar47._20_4_ = auVar83._20_4_ * auVar82._20_4_;
              auVar47._24_4_ = auVar83._24_4_ * auVar82._24_4_;
              auVar47._28_4_ = auVar83._28_4_;
              auVar66 = vfmsub231ps_fma(auVar47,auVar81,auVar72);
              auVar48._4_4_ = auVar71._4_4_ * auVar81._4_4_;
              auVar48._0_4_ = auVar71._0_4_ * auVar81._0_4_;
              auVar48._8_4_ = auVar71._8_4_ * auVar81._8_4_;
              auVar48._12_4_ = auVar71._12_4_ * auVar81._12_4_;
              auVar48._16_4_ = auVar71._16_4_ * auVar81._16_4_;
              auVar48._20_4_ = auVar71._20_4_ * auVar81._20_4_;
              auVar48._24_4_ = auVar71._24_4_ * auVar81._24_4_;
              auVar48._28_4_ = auVar71._28_4_;
              auVar16 = vfmsub231ps_fma(auVar48,auVar82,auVar85);
              auVar68 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar66),ZEXT1632(auVar16));
              auVar84 = vfmadd231ps_avx512vl(ZEXT1632(auVar68),ZEXT1632(auVar176),auVar94);
              auVar85 = vrcp14ps_avx512vl(auVar84);
              auVar82 = auVar175._0_32_;
              auVar83 = vfnmadd213ps_avx512vl(auVar85,auVar84,auVar82);
              auVar68 = vfmadd132ps_fma(auVar83,auVar85,auVar85);
              auVar49._4_4_ = auVar16._4_4_ * auVar101._4_4_;
              auVar49._0_4_ = auVar16._0_4_ * auVar101._0_4_;
              auVar49._8_4_ = auVar16._8_4_ * auVar101._8_4_;
              auVar49._12_4_ = auVar16._12_4_ * auVar101._12_4_;
              auVar49._16_4_ = fVar137 * 0.0;
              auVar49._20_4_ = fVar123 * 0.0;
              auVar49._24_4_ = fVar124 * 0.0;
              auVar49._28_4_ = iVar1;
              auVar66 = vfmadd231ps_fma(auVar49,auVar74,ZEXT1632(auVar66));
              auVar66 = vfmadd231ps_fma(ZEXT1632(auVar66),auVar73,ZEXT1632(auVar176));
              fVar137 = auVar68._0_4_;
              fVar123 = auVar68._4_4_;
              fVar124 = auVar68._8_4_;
              fVar125 = auVar68._12_4_;
              local_620 = ZEXT1632(CONCAT412(auVar66._12_4_ * fVar125,
                                             CONCAT48(auVar66._8_4_ * fVar124,
                                                      CONCAT44(auVar66._4_4_ * fVar123,
                                                               auVar66._0_4_ * fVar137))));
              uVar23 = vcmpps_avx512vl(local_620,auVar170,2);
              auVar52._4_4_ = uStack_6bc;
              auVar52._0_4_ = local_6c0;
              auVar52._8_4_ = uStack_6b8;
              auVar52._12_4_ = uStack_6b4;
              auVar52._16_4_ = uStack_6b0;
              auVar52._20_4_ = uStack_6ac;
              auVar52._24_4_ = uStack_6a8;
              auVar52._28_4_ = uStack_6a4;
              uVar24 = vcmpps_avx512vl(local_620,auVar52,0xd);
              bVar62 = (byte)uVar23 & (byte)uVar24 & bVar62;
              if (bVar62 != 0) {
                uVar23 = vcmpps_avx512vl(auVar84,auVar94,4);
                bVar62 = bVar62 & (byte)uVar23;
                auVar122 = ZEXT3264(local_8e0);
                if (bVar62 != 0) {
                  fVar153 = auVar75._0_4_ * fVar137;
                  fVar157 = auVar75._4_4_ * fVar123;
                  auVar50._4_4_ = fVar157;
                  auVar50._0_4_ = fVar153;
                  fVar158 = auVar75._8_4_ * fVar124;
                  auVar50._8_4_ = fVar158;
                  fVar159 = auVar75._12_4_ * fVar125;
                  auVar50._12_4_ = fVar159;
                  fVar160 = auVar75._16_4_ * 0.0;
                  auVar50._16_4_ = fVar160;
                  fVar63 = auVar75._20_4_ * 0.0;
                  auVar50._20_4_ = fVar63;
                  fVar64 = auVar75._24_4_ * 0.0;
                  auVar50._24_4_ = fVar64;
                  auVar50._28_4_ = auVar84._28_4_;
                  auVar85 = vsubps_avx512vl(auVar82,auVar50);
                  local_660._0_4_ =
                       (float)((uint)(bVar54 & 1) * (int)fVar153 |
                              (uint)!(bool)(bVar54 & 1) * auVar85._0_4_);
                  bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
                  local_660._4_4_ =
                       (float)((uint)bVar10 * (int)fVar157 | (uint)!bVar10 * auVar85._4_4_);
                  bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
                  local_660._8_4_ =
                       (float)((uint)bVar10 * (int)fVar158 | (uint)!bVar10 * auVar85._8_4_);
                  bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
                  local_660._12_4_ =
                       (float)((uint)bVar10 * (int)fVar159 | (uint)!bVar10 * auVar85._12_4_);
                  bVar10 = (bool)((byte)(uVar55 >> 4) & 1);
                  local_660._16_4_ =
                       (float)((uint)bVar10 * (int)fVar160 | (uint)!bVar10 * auVar85._16_4_);
                  bVar10 = (bool)((byte)(uVar55 >> 5) & 1);
                  local_660._20_4_ =
                       (float)((uint)bVar10 * (int)fVar63 | (uint)!bVar10 * auVar85._20_4_);
                  bVar10 = (bool)((byte)(uVar55 >> 6) & 1);
                  local_660._24_4_ =
                       (float)((uint)bVar10 * (int)fVar64 | (uint)!bVar10 * auVar85._24_4_);
                  bVar10 = SUB81(uVar55 >> 7,0);
                  local_660._28_4_ =
                       (float)((uint)bVar10 * auVar84._28_4_ | (uint)!bVar10 * auVar85._28_4_);
                  auVar84 = vsubps_avx(auVar86,auVar78);
                  auVar68 = vfmadd213ps_fma(auVar84,local_660,auVar78);
                  uVar115 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                  auVar26._4_4_ = uVar115;
                  auVar26._0_4_ = uVar115;
                  auVar26._8_4_ = uVar115;
                  auVar26._12_4_ = uVar115;
                  auVar26._16_4_ = uVar115;
                  auVar26._20_4_ = uVar115;
                  auVar26._24_4_ = uVar115;
                  auVar26._28_4_ = uVar115;
                  auVar84 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar68._12_4_ + auVar68._12_4_,
                                                               CONCAT48(auVar68._8_4_ +
                                                                        auVar68._8_4_,
                                                                        CONCAT44(auVar68._4_4_ +
                                                                                 auVar68._4_4_,
                                                                                 auVar68._0_4_ +
                                                                                 auVar68._0_4_)))),
                                            auVar26);
                  uVar23 = vcmpps_avx512vl(local_620,auVar84,6);
                  if (((byte)uVar23 & bVar62) != 0) {
                    auVar129._0_4_ = auVar76._0_4_ * fVar137;
                    auVar129._4_4_ = auVar76._4_4_ * fVar123;
                    auVar129._8_4_ = auVar76._8_4_ * fVar124;
                    auVar129._12_4_ = auVar76._12_4_ * fVar125;
                    auVar129._16_4_ = auVar76._16_4_ * 0.0;
                    auVar129._20_4_ = auVar76._20_4_ * 0.0;
                    auVar129._24_4_ = auVar76._24_4_ * 0.0;
                    auVar129._28_4_ = 0;
                    auVar84 = vsubps_avx512vl(auVar82,auVar129);
                    auVar106._0_4_ =
                         (uint)(bVar54 & 1) * (int)auVar129._0_4_ |
                         (uint)!(bool)(bVar54 & 1) * auVar84._0_4_;
                    bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
                    auVar106._4_4_ =
                         (uint)bVar10 * (int)auVar129._4_4_ | (uint)!bVar10 * auVar84._4_4_;
                    bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
                    auVar106._8_4_ =
                         (uint)bVar10 * (int)auVar129._8_4_ | (uint)!bVar10 * auVar84._8_4_;
                    bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
                    auVar106._12_4_ =
                         (uint)bVar10 * (int)auVar129._12_4_ | (uint)!bVar10 * auVar84._12_4_;
                    bVar10 = (bool)((byte)(uVar55 >> 4) & 1);
                    auVar106._16_4_ =
                         (uint)bVar10 * (int)auVar129._16_4_ | (uint)!bVar10 * auVar84._16_4_;
                    bVar10 = (bool)((byte)(uVar55 >> 5) & 1);
                    auVar106._20_4_ =
                         (uint)bVar10 * (int)auVar129._20_4_ | (uint)!bVar10 * auVar84._20_4_;
                    bVar10 = (bool)((byte)(uVar55 >> 6) & 1);
                    auVar106._24_4_ =
                         (uint)bVar10 * (int)auVar129._24_4_ | (uint)!bVar10 * auVar84._24_4_;
                    auVar106._28_4_ = (uint)!SUB81(uVar55 >> 7,0) * auVar84._28_4_;
                    auVar27._8_4_ = 0x40000000;
                    auVar27._0_8_ = 0x4000000040000000;
                    auVar27._12_4_ = 0x40000000;
                    auVar27._16_4_ = 0x40000000;
                    auVar27._20_4_ = 0x40000000;
                    auVar27._24_4_ = 0x40000000;
                    auVar27._28_4_ = 0x40000000;
                    local_640 = vfmsub132ps_avx512vl(auVar106,auVar82,auVar27);
                    local_600 = (undefined4)lVar59;
                    local_5f0 = local_8a0._0_8_;
                    uStack_5e8 = local_8a0._8_8_;
                    local_5e0 = local_890._0_8_;
                    uStack_5d8 = local_890._8_8_;
                    local_5d0 = local_8b0._0_8_;
                    uStack_5c8 = local_8b0._8_8_;
                    pGVar8 = (context->scene->geometries).items[uVar6].ptr;
                    if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                      bVar54 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar54 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar68 = vcvtsi2ss_avx512f(auVar175._0_16_,local_600);
                      fVar137 = auVar68._0_4_;
                      local_5a0[0] = (fVar137 + local_660._0_4_ + 0.0) * (float)local_720;
                      local_5a0[1] = (fVar137 + local_660._4_4_ + 1.0) * local_720._4_4_;
                      local_5a0[2] = (fVar137 + local_660._8_4_ + 2.0) * fStack_718;
                      local_5a0[3] = (fVar137 + local_660._12_4_ + 3.0) * fStack_714;
                      fStack_590 = (fVar137 + local_660._16_4_ + 4.0) * fStack_710;
                      fStack_58c = (fVar137 + local_660._20_4_ + 5.0) * fStack_70c;
                      fStack_588 = (fVar137 + local_660._24_4_ + 6.0) * fStack_708;
                      fStack_584 = fVar137 + local_660._28_4_ + 7.0;
                      local_580 = local_640;
                      local_560 = local_620;
                      uVar55 = CONCAT71(0,(byte)uVar23 & bVar62);
                      local_540._0_8_ = uVar55;
                      lVar56 = 0;
                      for (; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
                        lVar56 = lVar56 + 1;
                      }
                      local_500._0_8_ = lVar56;
                      local_760._0_4_ = (int)uVar58;
                      local_4a0 = auVar170;
                      local_5fc = iVar7;
                      do {
                        auVar176 = auVar177._0_16_;
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_5a0[local_500._0_8_]));
                        local_1c0 = vbroadcastss_avx512f
                                              (ZEXT416(*(uint *)(local_580 + local_500._0_8_ * 4)));
                        *(undefined4 *)(ray + k * 4 + 0x200) =
                             *(undefined4 *)(local_560 + local_500._0_8_ * 4);
                        local_910.context = context->user;
                        fVar125 = local_200._0_4_;
                        fVar123 = 1.0 - fVar125;
                        fVar137 = fVar123 * fVar123 * -3.0;
                        auVar68 = vfmadd231ss_fma(ZEXT416((uint)(fVar123 * fVar123)),
                                                  ZEXT416((uint)(fVar125 * fVar123)),
                                                  ZEXT416(0xc0000000));
                        auVar66 = vfmsub132ss_fma(ZEXT416((uint)(fVar125 * fVar123)),
                                                  ZEXT416((uint)(fVar125 * fVar125)),
                                                  ZEXT416(0x40000000));
                        fVar123 = auVar68._0_4_ * 3.0;
                        fVar124 = auVar66._0_4_ * 3.0;
                        fVar125 = fVar125 * fVar125 * 3.0;
                        auVar152._0_4_ = fVar125 * (float)local_730._0_4_;
                        auVar152._4_4_ = fVar125 * (float)local_730._4_4_;
                        auVar152._8_4_ = fVar125 * fStack_728;
                        auVar152._12_4_ = fVar125 * fStack_724;
                        auVar120._4_4_ = fVar124;
                        auVar120._0_4_ = fVar124;
                        auVar120._8_4_ = fVar124;
                        auVar120._12_4_ = fVar124;
                        auVar68 = vfmadd132ps_fma(auVar120,auVar152,local_8b0);
                        auVar141._4_4_ = fVar123;
                        auVar141._0_4_ = fVar123;
                        auVar141._8_4_ = fVar123;
                        auVar141._12_4_ = fVar123;
                        auVar68 = vfmadd132ps_fma(auVar141,auVar68,local_890);
                        auVar121._4_4_ = fVar137;
                        auVar121._0_4_ = fVar137;
                        auVar121._8_4_ = fVar137;
                        auVar121._12_4_ = fVar137;
                        auVar68 = vfmadd132ps_fma(auVar121,auVar68,local_8a0);
                        auVar180 = vbroadcastss_avx512f(auVar68);
                        auVar181 = vbroadcastss_avx512f(ZEXT416(1));
                        local_280 = vpermps_avx512f(auVar181,ZEXT1664(auVar68));
                        auVar181 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar181,ZEXT1664(auVar68));
                        local_2c0[0] = (RTCHitN)auVar180[0];
                        local_2c0[1] = (RTCHitN)auVar180[1];
                        local_2c0[2] = (RTCHitN)auVar180[2];
                        local_2c0[3] = (RTCHitN)auVar180[3];
                        local_2c0[4] = (RTCHitN)auVar180[4];
                        local_2c0[5] = (RTCHitN)auVar180[5];
                        local_2c0[6] = (RTCHitN)auVar180[6];
                        local_2c0[7] = (RTCHitN)auVar180[7];
                        local_2c0[8] = (RTCHitN)auVar180[8];
                        local_2c0[9] = (RTCHitN)auVar180[9];
                        local_2c0[10] = (RTCHitN)auVar180[10];
                        local_2c0[0xb] = (RTCHitN)auVar180[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar180[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar180[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar180[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar180[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar180[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar180[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar180[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar180[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar180[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar180[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar180[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar180[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar180[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar180[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar180[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar180[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar180[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar180[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar180[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar180[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar180[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar180[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar180[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar180[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar180[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar180[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar180[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar180[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar180[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar180[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar180[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar180[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar180[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar180[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar180[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar180[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar180[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar180[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar180[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar180[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar180[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar180[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar180[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar180[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar180[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar180[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar180[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar180[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar180[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar180[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar180[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar180[0x3f];
                        local_180 = local_400._0_8_;
                        uStack_178 = local_400._8_8_;
                        uStack_170 = local_400._16_8_;
                        uStack_168 = local_400._24_8_;
                        uStack_160 = local_400._32_8_;
                        uStack_158 = local_400._40_8_;
                        uStack_150 = local_400._48_8_;
                        uStack_148 = local_400._56_8_;
                        auVar180 = vmovdqa64_avx512f(local_440);
                        local_140 = vmovdqa64_avx512f(auVar180);
                        vpcmpeqd_avx2(auVar180._0_32_,auVar180._0_32_);
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instPrimID[0]))
                        ;
                        auVar180 = vmovdqa64_avx512f(local_300);
                        local_700 = vmovdqa64_avx512f(auVar180);
                        local_910.valid = (int *)local_700;
                        local_910.geometryUserPtr = pGVar8->userPtr;
                        local_910.hit = local_2c0;
                        local_910.N = 0x10;
                        local_910.ray = (RTCRayN *)ray;
                        if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar8->occlusionFilterN)(&local_910);
                          auVar171 = ZEXT3264(local_4a0);
                          uVar58 = (ulong)(uint)local_760._0_4_;
                          auVar122 = ZEXT3264(local_8e0);
                          auVar179 = ZEXT3264(local_7a0);
                          auVar178 = ZEXT3264(local_780);
                          auVar68 = vxorps_avx512vl(auVar176,auVar176);
                          auVar177 = ZEXT1664(auVar68);
                          auVar180 = vmovdqa64_avx512f(local_700);
                        }
                        auVar68 = auVar177._0_16_;
                        uVar23 = vptestmd_avx512f(auVar180,auVar180);
                        if ((short)uVar23 == 0) {
                          auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar175 = ZEXT3264(auVar84);
                          auVar180 = ZEXT3264(local_800);
                          auVar182 = ZEXT3264(local_820);
                          auVar181 = ZEXT3264(local_840);
                          auVar183 = ZEXT3264(local_860);
                          auVar184 = ZEXT3264(local_880);
                        }
                        else {
                          p_Var9 = context->args->filter;
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var9)(&local_910);
                            auVar171 = ZEXT3264(local_4a0);
                            uVar58 = (ulong)(uint)local_760._0_4_;
                            auVar122 = ZEXT3264(local_8e0);
                            auVar179 = ZEXT3264(local_7a0);
                            auVar178 = ZEXT3264(local_780);
                            auVar68 = vxorps_avx512vl(auVar68,auVar68);
                            auVar177 = ZEXT1664(auVar68);
                            auVar180 = vmovdqa64_avx512f(local_700);
                          }
                          uVar55 = vptestmd_avx512f(auVar180,auVar180);
                          auVar181 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar10 = (bool)((byte)uVar55 & 1);
                          auVar180._0_4_ =
                               (uint)bVar10 * auVar181._0_4_ |
                               (uint)!bVar10 * *(int *)(local_910.ray + 0x200);
                          bVar10 = (bool)((byte)(uVar55 >> 1) & 1);
                          auVar180._4_4_ =
                               (uint)bVar10 * auVar181._4_4_ |
                               (uint)!bVar10 * *(int *)(local_910.ray + 0x204);
                          bVar10 = (bool)((byte)(uVar55 >> 2) & 1);
                          auVar180._8_4_ =
                               (uint)bVar10 * auVar181._8_4_ |
                               (uint)!bVar10 * *(int *)(local_910.ray + 0x208);
                          bVar10 = (bool)((byte)(uVar55 >> 3) & 1);
                          auVar180._12_4_ =
                               (uint)bVar10 * auVar181._12_4_ |
                               (uint)!bVar10 * *(int *)(local_910.ray + 0x20c);
                          bVar10 = (bool)((byte)(uVar55 >> 4) & 1);
                          auVar180._16_4_ =
                               (uint)bVar10 * auVar181._16_4_ |
                               (uint)!bVar10 * *(int *)(local_910.ray + 0x210);
                          bVar10 = (bool)((byte)(uVar55 >> 5) & 1);
                          auVar180._20_4_ =
                               (uint)bVar10 * auVar181._20_4_ |
                               (uint)!bVar10 * *(int *)(local_910.ray + 0x214);
                          bVar10 = (bool)((byte)(uVar55 >> 6) & 1);
                          auVar180._24_4_ =
                               (uint)bVar10 * auVar181._24_4_ |
                               (uint)!bVar10 * *(int *)(local_910.ray + 0x218);
                          bVar10 = (bool)((byte)(uVar55 >> 7) & 1);
                          auVar180._28_4_ =
                               (uint)bVar10 * auVar181._28_4_ |
                               (uint)!bVar10 * *(int *)(local_910.ray + 0x21c);
                          bVar10 = (bool)((byte)(uVar55 >> 8) & 1);
                          auVar180._32_4_ =
                               (uint)bVar10 * auVar181._32_4_ |
                               (uint)!bVar10 * *(int *)(local_910.ray + 0x220);
                          bVar10 = (bool)((byte)(uVar55 >> 9) & 1);
                          auVar180._36_4_ =
                               (uint)bVar10 * auVar181._36_4_ |
                               (uint)!bVar10 * *(int *)(local_910.ray + 0x224);
                          bVar10 = (bool)((byte)(uVar55 >> 10) & 1);
                          auVar180._40_4_ =
                               (uint)bVar10 * auVar181._40_4_ |
                               (uint)!bVar10 * *(int *)(local_910.ray + 0x228);
                          bVar10 = (bool)((byte)(uVar55 >> 0xb) & 1);
                          auVar180._44_4_ =
                               (uint)bVar10 * auVar181._44_4_ |
                               (uint)!bVar10 * *(int *)(local_910.ray + 0x22c);
                          bVar10 = (bool)((byte)(uVar55 >> 0xc) & 1);
                          auVar180._48_4_ =
                               (uint)bVar10 * auVar181._48_4_ |
                               (uint)!bVar10 * *(int *)(local_910.ray + 0x230);
                          bVar10 = (bool)((byte)(uVar55 >> 0xd) & 1);
                          auVar180._52_4_ =
                               (uint)bVar10 * auVar181._52_4_ |
                               (uint)!bVar10 * *(int *)(local_910.ray + 0x234);
                          bVar10 = (bool)((byte)(uVar55 >> 0xe) & 1);
                          auVar180._56_4_ =
                               (uint)bVar10 * auVar181._56_4_ |
                               (uint)!bVar10 * *(int *)(local_910.ray + 0x238);
                          bVar10 = SUB81(uVar55 >> 0xf,0);
                          auVar180._60_4_ =
                               (uint)bVar10 * auVar181._60_4_ |
                               (uint)!bVar10 * *(int *)(local_910.ray + 0x23c);
                          *(undefined1 (*) [64])(local_910.ray + 0x200) = auVar180;
                          auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar175 = ZEXT3264(auVar84);
                          auVar180 = ZEXT3264(local_800);
                          auVar182 = ZEXT3264(local_820);
                          auVar181 = ZEXT3264(local_840);
                          auVar183 = ZEXT3264(local_860);
                          auVar184 = ZEXT3264(local_880);
                          if ((short)uVar55 != 0) {
                            bVar54 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x200) = auVar171._0_4_;
                        local_540._0_8_ = local_540._0_8_ ^ 1L << (local_500._0_8_ & 0x3f);
                        bVar54 = 0;
                        lVar56 = 0;
                        for (uVar55 = local_540._0_8_; (uVar55 & 1) == 0;
                            uVar55 = uVar55 >> 1 | 0x8000000000000000) {
                          lVar56 = lVar56 + 1;
                        }
                        local_500._0_8_ = lVar56;
                      } while (local_540._0_8_ != 0);
                    }
                    uVar58 = CONCAT71((int7)(uVar58 >> 8),(byte)uVar58 | bVar54);
                  }
                }
                goto LAB_01aa68e0;
              }
            }
            auVar122 = ZEXT3264(local_8e0);
          }
LAB_01aa68e0:
          lVar59 = lVar59 + 8;
        } while ((int)lVar59 < iVar7);
      }
      bVar62 = (byte)uVar58;
      if ((uVar58 & 1) != 0) break;
      uVar115 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar25._4_4_ = uVar115;
      auVar25._0_4_ = uVar115;
      auVar25._8_4_ = uVar115;
      auVar25._12_4_ = uVar115;
      uVar23 = vcmpps_avx512vl(local_670,auVar25,2);
      uVar60 = (uint)uVar61 & (uint)uVar61 + 0xf & (uint)uVar23;
      uVar61 = (ulong)uVar60;
    } while (uVar60 != 0);
  }
  return (bool)(bVar62 & 1);
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }